

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  int iVar48;
  ulong uVar49;
  long lVar50;
  byte bVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  uint uVar56;
  float fVar57;
  undefined4 uVar58;
  float fVar59;
  float fVar60;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  float fVar87;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar85;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar88;
  vint4 bi_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  vint4 ai_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  float fVar143;
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar159;
  float fVar177;
  float fVar178;
  vfloat4 b0_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar179;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  float fVar191;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar183 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar192;
  undefined1 auVar190 [32];
  float fVar196;
  float fVar209;
  vint4 ai_1;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar210;
  float fVar225;
  vfloat4 a0_2;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar226;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  vfloat4 a0_3;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar244;
  float fVar257;
  float fVar258;
  vfloat4 a0_1;
  undefined1 auVar248 [16];
  undefined1 auVar245 [16];
  float fVar259;
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar247 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  vfloat4 a0;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar283 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6c0 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [32];
  RTCFilterFunctionNArguments local_5d0;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  uint auStack_4d0 [4];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 auStack_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [16];
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar282 [32];
  
  PVar3 = prim[1];
  uVar55 = (ulong)(byte)PVar3;
  fVar57 = *(float *)(prim + uVar55 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar55 * 0x19 + 6));
  auVar240._0_4_ = fVar57 * auVar9._0_4_;
  auVar240._4_4_ = fVar57 * auVar9._4_4_;
  auVar240._8_4_ = fVar57 * auVar9._8_4_;
  auVar240._12_4_ = fVar57 * auVar9._12_4_;
  auVar123._0_4_ = fVar57 * auVar10._0_4_;
  auVar123._4_4_ = fVar57 * auVar10._4_4_;
  auVar123._8_4_ = fVar57 * auVar10._8_4_;
  auVar123._12_4_ = fVar57 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 6 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xb + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar55 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  uVar49 = (ulong)(uint)((int)(uVar55 * 9) * 2);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + uVar55 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  uVar49 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar269._4_4_ = auVar123._0_4_;
  auVar269._0_4_ = auVar123._0_4_;
  auVar269._8_4_ = auVar123._0_4_;
  auVar269._12_4_ = auVar123._0_4_;
  auVar248 = vshufps_avx(auVar123,auVar123,0x55);
  auVar61 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar57 = auVar61._0_4_;
  auVar238._0_4_ = fVar57 * auVar126._0_4_;
  fVar84 = auVar61._4_4_;
  auVar238._4_4_ = fVar84 * auVar126._4_4_;
  fVar86 = auVar61._8_4_;
  auVar238._8_4_ = fVar86 * auVar126._8_4_;
  fVar87 = auVar61._12_4_;
  auVar238._12_4_ = fVar87 * auVar126._12_4_;
  auVar227._0_4_ = auVar14._0_4_ * fVar57;
  auVar227._4_4_ = auVar14._4_4_ * fVar84;
  auVar227._8_4_ = auVar14._8_4_ * fVar86;
  auVar227._12_4_ = auVar14._12_4_ * fVar87;
  auVar197._0_4_ = auVar108._0_4_ * fVar57;
  auVar197._4_4_ = auVar108._4_4_ * fVar84;
  auVar197._8_4_ = auVar108._8_4_ * fVar86;
  auVar197._12_4_ = auVar108._12_4_ * fVar87;
  auVar61 = vfmadd231ps_fma(auVar238,auVar248,auVar10);
  auVar90 = vfmadd231ps_fma(auVar227,auVar248,auVar13);
  auVar248 = vfmadd231ps_fma(auVar197,auVar62,auVar248);
  auVar119 = vfmadd231ps_fma(auVar61,auVar269,auVar9);
  auVar90 = vfmadd231ps_fma(auVar90,auVar269,auVar12);
  auVar135 = vfmadd231ps_fma(auVar248,auVar63,auVar269);
  auVar270._4_4_ = auVar240._0_4_;
  auVar270._0_4_ = auVar240._0_4_;
  auVar270._8_4_ = auVar240._0_4_;
  auVar270._12_4_ = auVar240._0_4_;
  auVar248 = vshufps_avx(auVar240,auVar240,0x55);
  auVar61 = vshufps_avx(auVar240,auVar240,0xaa);
  fVar57 = auVar61._0_4_;
  auVar144._0_4_ = fVar57 * auVar126._0_4_;
  fVar84 = auVar61._4_4_;
  auVar144._4_4_ = fVar84 * auVar126._4_4_;
  fVar86 = auVar61._8_4_;
  auVar144._8_4_ = fVar86 * auVar126._8_4_;
  fVar87 = auVar61._12_4_;
  auVar144._12_4_ = fVar87 * auVar126._12_4_;
  auVar89._0_4_ = auVar14._0_4_ * fVar57;
  auVar89._4_4_ = auVar14._4_4_ * fVar84;
  auVar89._8_4_ = auVar14._8_4_ * fVar86;
  auVar89._12_4_ = auVar14._12_4_ * fVar87;
  auVar61._0_4_ = auVar108._0_4_ * fVar57;
  auVar61._4_4_ = auVar108._4_4_ * fVar84;
  auVar61._8_4_ = auVar108._8_4_ * fVar86;
  auVar61._12_4_ = auVar108._12_4_ * fVar87;
  auVar10 = vfmadd231ps_fma(auVar144,auVar248,auVar10);
  auVar126 = vfmadd231ps_fma(auVar89,auVar248,auVar13);
  auVar13 = vfmadd231ps_fma(auVar61,auVar248,auVar62);
  auVar14 = vfmadd231ps_fma(auVar10,auVar270,auVar9);
  auVar62 = vfmadd231ps_fma(auVar126,auVar270,auVar12);
  auVar108 = vfmadd231ps_fma(auVar13,auVar270,auVar63);
  local_4f0._8_4_ = 0x7fffffff;
  local_4f0._0_8_ = 0x7fffffff7fffffff;
  local_4f0._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar119,local_4f0);
  auVar134._8_4_ = 0x219392ef;
  auVar134._0_8_ = 0x219392ef219392ef;
  auVar134._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar134,1);
  auVar10 = vblendvps_avx(auVar119,auVar134,auVar9);
  auVar9 = vandps_avx(auVar90,local_4f0);
  auVar9 = vcmpps_avx(auVar9,auVar134,1);
  auVar126 = vblendvps_avx(auVar90,auVar134,auVar9);
  auVar9 = vandps_avx(auVar135,local_4f0);
  auVar9 = vcmpps_avx(auVar9,auVar134,1);
  auVar9 = vblendvps_avx(auVar135,auVar134,auVar9);
  auVar12 = vrcpps_avx(auVar10);
  auVar180._8_4_ = 0x3f800000;
  auVar180._0_8_ = 0x3f8000003f800000;
  auVar180._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar12,auVar180);
  auVar12 = vfmadd132ps_fma(auVar10,auVar12,auVar12);
  auVar10 = vrcpps_avx(auVar126);
  auVar126 = vfnmadd213ps_fma(auVar126,auVar10,auVar180);
  auVar13 = vfmadd132ps_fma(auVar126,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar180);
  auVar63 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar55 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar14);
  auVar135._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar135._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar135._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar135._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar55 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar14);
  auVar145._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar145._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar145._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar145._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar90._1_3_ = 0;
  auVar90[0] = PVar3;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar126);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar55 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar62);
  auVar198._0_4_ = auVar9._0_4_ * auVar13._0_4_;
  auVar198._4_4_ = auVar9._4_4_ * auVar13._4_4_;
  auVar198._8_4_ = auVar9._8_4_ * auVar13._8_4_;
  auVar198._12_4_ = auVar9._12_4_ * auVar13._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar10);
  auVar9 = vsubps_avx(auVar9,auVar62);
  auVar248._0_4_ = auVar13._0_4_ * auVar9._0_4_;
  auVar248._4_4_ = auVar13._4_4_ * auVar9._4_4_;
  auVar248._8_4_ = auVar13._8_4_ * auVar9._8_4_;
  auVar248._12_4_ = auVar13._12_4_ * auVar9._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar49 + uVar55 + 6);
  auVar9 = vpmovsxwd_avx(auVar13);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar108);
  auVar119._0_4_ = auVar63._0_4_ * auVar9._0_4_;
  auVar119._4_4_ = auVar63._4_4_ * auVar9._4_4_;
  auVar119._8_4_ = auVar63._8_4_ * auVar9._8_4_;
  auVar119._12_4_ = auVar63._12_4_ * auVar9._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar55 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar14);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar108);
  auVar62._0_4_ = auVar63._0_4_ * auVar9._0_4_;
  auVar62._4_4_ = auVar63._4_4_ * auVar9._4_4_;
  auVar62._8_4_ = auVar63._8_4_ * auVar9._8_4_;
  auVar62._12_4_ = auVar63._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar135,auVar145);
  auVar10 = vpminsd_avx(auVar198,auVar248);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar119,auVar62);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar211._4_4_ = uVar58;
  auVar211._0_4_ = uVar58;
  auVar211._8_4_ = uVar58;
  auVar211._12_4_ = uVar58;
  auVar10 = vmaxps_avx(auVar10,auVar211);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  local_480._0_4_ = auVar9._0_4_ * 0.99999964;
  local_480._4_4_ = auVar9._4_4_ * 0.99999964;
  local_480._8_4_ = auVar9._8_4_ * 0.99999964;
  local_480._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar135,auVar145);
  auVar10 = vpmaxsd_avx(auVar198,auVar248);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar119,auVar62);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar108._4_4_ = uVar58;
  auVar108._0_4_ = uVar58;
  auVar108._8_4_ = uVar58;
  auVar108._12_4_ = uVar58;
  auVar10 = vminps_avx(auVar10,auVar108);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar63._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar63._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar63._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar63._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar90[4] = PVar3;
  auVar90._5_3_ = 0;
  auVar90[8] = PVar3;
  auVar90._9_3_ = 0;
  auVar90[0xc] = PVar3;
  auVar90._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar90,_DAT_01f7fcf0);
  auVar9 = vcmpps_avx(local_480,auVar63,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar47 = vmovmskps_avx(auVar9);
  if (uVar47 == 0) {
    return;
  }
  uVar47 = uVar47 & 0xff;
  auVar79._16_16_ = mm_lookupmask_ps._240_16_;
  auVar79._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar79,ZEXT832(0) << 0x20,0x80);
  iVar48 = 1 << ((uint)k & 0x1f);
  auVar80._4_4_ = iVar48;
  auVar80._0_4_ = iVar48;
  auVar80._8_4_ = iVar48;
  auVar80._12_4_ = iVar48;
  auVar80._16_4_ = iVar48;
  auVar80._20_4_ = iVar48;
  auVar80._24_4_ = iVar48;
  auVar80._28_4_ = iVar48;
  auVar16 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar79 = vpand_avx2(auVar80,auVar16);
  local_360 = vpcmpeqd_avx2(auVar79,auVar16);
  do {
    lVar50 = 0;
    uVar55 = (ulong)uVar47;
    for (uVar49 = uVar55; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
      lVar50 = lVar50 + 1;
    }
    uVar47 = *(uint *)(prim + 2);
    uVar4 = *(uint *)(prim + lVar50 * 4 + 6);
    pGVar5 = (context->scene->geometries).items[uVar47].ptr;
    uVar49 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                             pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)uVar4);
    p_Var6 = pGVar5[1].intersectionFilterN;
    pvVar7 = pGVar5[2].userPtr;
    _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar14 = *(undefined1 (*) [16])(_Var8 + uVar49 * (long)pvVar7);
    auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar49 + 1) * (long)pvVar7);
    auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar49 + 2) * (long)pvVar7);
    pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar49 + 3));
    fVar57 = *pfVar1;
    fVar84 = pfVar1[1];
    fVar86 = pfVar1[2];
    fVar87 = pfVar1[3];
    lVar50 = *(long *)&pGVar5[1].time_range.upper;
    auVar126 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * uVar49);
    auVar12 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar49 + 1));
    auVar13 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar49 + 2));
    uVar55 = uVar55 - 1 & uVar55;
    pfVar1 = (float *)(lVar50 + (long)p_Var6 * (uVar49 + 3));
    fVar158 = *pfVar1;
    fVar177 = pfVar1[1];
    fVar178 = pfVar1[2];
    fVar179 = pfVar1[3];
    if (uVar55 != 0) {
      uVar54 = uVar55 - 1 & uVar55;
      for (uVar49 = uVar55; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
      }
      if (uVar54 != 0) {
        for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar277._8_4_ = 0x80000000;
    auVar277._0_8_ = 0x8000000080000000;
    auVar277._12_4_ = 0x80000000;
    auVar120._0_4_ = fVar158 * -0.0;
    auVar120._4_4_ = fVar177 * -0.0;
    auVar120._8_4_ = fVar178 * -0.0;
    auVar120._12_4_ = fVar179 * -0.0;
    auVar62 = vfmadd213ps_fma((undefined1  [16])0x0,auVar13,auVar120);
    auVar64._0_4_ = auVar12._0_4_ + auVar62._0_4_;
    auVar64._4_4_ = auVar12._4_4_ + auVar62._4_4_;
    auVar64._8_4_ = auVar12._8_4_ + auVar62._8_4_;
    auVar64._12_4_ = auVar12._12_4_ + auVar62._12_4_;
    auVar108 = vfmadd231ps_fma(auVar64,auVar126,auVar277);
    auVar91._12_4_ = 0;
    auVar91._0_12_ = ZEXT812(0);
    auVar91 = auVar91 << 0x20;
    auVar109._0_4_ = fVar158 * 0.0;
    auVar109._4_4_ = fVar177 * 0.0;
    auVar109._8_4_ = fVar178 * 0.0;
    auVar109._12_4_ = fVar179 * 0.0;
    auVar199._8_4_ = 0x3f000000;
    auVar199._0_8_ = 0x3f0000003f000000;
    auVar199._12_4_ = 0x3f000000;
    auVar62 = vfmadd231ps_fma(auVar109,auVar13,auVar199);
    auVar62 = vfmadd231ps_fma(auVar62,auVar12,auVar91);
    auVar90 = vfnmadd231ps_fma(auVar62,auVar126,auVar199);
    auVar271._0_4_ = fVar57 * -0.0;
    auVar271._4_4_ = fVar84 * -0.0;
    auVar271._8_4_ = fVar86 * -0.0;
    auVar271._12_4_ = fVar87 * -0.0;
    auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar10,auVar271);
    auVar260._0_4_ = auVar9._0_4_ + auVar62._0_4_;
    auVar260._4_4_ = auVar9._4_4_ + auVar62._4_4_;
    auVar260._8_4_ = auVar9._8_4_ + auVar62._8_4_;
    auVar260._12_4_ = auVar9._12_4_ + auVar62._12_4_;
    auVar62 = vfmadd231ps_fma(auVar260,auVar14,auVar277);
    auVar245._0_4_ = fVar57 * 0.0;
    auVar245._4_4_ = fVar84 * 0.0;
    auVar245._8_4_ = fVar86 * 0.0;
    auVar245._12_4_ = fVar87 * 0.0;
    auVar248 = vfmadd231ps_fma(auVar245,auVar10,auVar199);
    auVar248 = vfmadd231ps_fma(auVar248,auVar9,auVar91);
    auVar119 = vfnmadd231ps_fma(auVar248,auVar14,auVar199);
    auVar121._0_4_ = auVar13._0_4_ + auVar120._0_4_;
    auVar121._4_4_ = auVar13._4_4_ + auVar120._4_4_;
    auVar121._8_4_ = auVar13._8_4_ + auVar120._8_4_;
    auVar121._12_4_ = auVar13._12_4_ + auVar120._12_4_;
    auVar248 = vfmadd231ps_fma(auVar121,auVar12,auVar91);
    auVar248 = vfmadd231ps_fma(auVar248,auVar126,auVar277);
    auVar136._0_4_ = fVar158 * 0.5;
    auVar136._4_4_ = fVar177 * 0.5;
    auVar136._8_4_ = fVar178 * 0.5;
    auVar136._12_4_ = fVar179 * 0.5;
    auVar13 = vfmadd231ps_fma(auVar136,auVar91,auVar13);
    auVar12 = vfnmadd231ps_fma(auVar13,auVar199,auVar12);
    auVar61 = vfmadd231ps_fma(auVar12,auVar91,auVar126);
    auVar212._0_4_ = auVar271._0_4_ + auVar10._0_4_;
    auVar212._4_4_ = auVar271._4_4_ + auVar10._4_4_;
    auVar212._8_4_ = auVar271._8_4_ + auVar10._8_4_;
    auVar212._12_4_ = auVar271._12_4_ + auVar10._12_4_;
    auVar126 = vfmadd231ps_fma(auVar212,auVar9,auVar91);
    auVar13 = vfmadd231ps_fma(auVar126,auVar14,auVar277);
    auVar228._0_4_ = fVar57 * 0.5;
    auVar228._4_4_ = fVar84 * 0.5;
    auVar228._8_4_ = fVar86 * 0.5;
    auVar228._12_4_ = fVar87 * 0.5;
    auVar10 = vfmadd231ps_fma(auVar228,auVar91,auVar10);
    auVar9 = vfnmadd231ps_fma(auVar10,auVar199,auVar9);
    auVar14 = vfmadd231ps_fma(auVar9,auVar91,auVar14);
    auVar9 = vshufps_avx(auVar90,auVar90,0xc9);
    auVar10 = vshufps_avx(auVar62,auVar62,0xc9);
    fVar118 = auVar90._0_4_;
    auVar160._0_4_ = fVar118 * auVar10._0_4_;
    fVar85 = auVar90._4_4_;
    auVar160._4_4_ = fVar85 * auVar10._4_4_;
    fVar60 = auVar90._8_4_;
    auVar160._8_4_ = fVar60 * auVar10._8_4_;
    fVar159 = auVar90._12_4_;
    auVar160._12_4_ = fVar159 * auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar160,auVar9,auVar62);
    auVar126 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar10 = vshufps_avx(auVar119,auVar119,0xc9);
    auVar161._0_4_ = fVar118 * auVar10._0_4_;
    auVar161._4_4_ = fVar85 * auVar10._4_4_;
    auVar161._8_4_ = fVar60 * auVar10._8_4_;
    auVar161._12_4_ = fVar159 * auVar10._12_4_;
    auVar9 = vfmsub231ps_fma(auVar161,auVar9,auVar119);
    auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
    auVar9 = vshufps_avx(auVar61,auVar61,0xc9);
    auVar10 = vshufps_avx(auVar13,auVar13,0xc9);
    fVar59 = auVar61._0_4_;
    auVar146._0_4_ = fVar59 * auVar10._0_4_;
    fVar226 = auVar61._4_4_;
    auVar146._4_4_ = fVar226 * auVar10._4_4_;
    fVar133 = auVar61._8_4_;
    auVar146._8_4_ = fVar133 * auVar10._8_4_;
    fVar143 = auVar61._12_4_;
    auVar146._12_4_ = fVar143 * auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar146,auVar9,auVar13);
    auVar13 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar10 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar181._0_4_ = fVar59 * auVar10._0_4_;
    auVar181._4_4_ = fVar226 * auVar10._4_4_;
    auVar181._8_4_ = fVar133 * auVar10._8_4_;
    auVar181._12_4_ = fVar143 * auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar181,auVar9,auVar14);
    auVar9 = vdpps_avx(auVar126,auVar126,0x7f);
    auVar14 = vshufps_avx(auVar10,auVar10,0xc9);
    fVar84 = auVar9._0_4_;
    auVar62 = ZEXT416((uint)fVar84);
    auVar10 = vrsqrtss_avx(auVar62,auVar62);
    fVar57 = auVar10._0_4_;
    auVar10 = vdpps_avx(auVar126,auVar12,0x7f);
    fVar57 = fVar57 * 1.5 + fVar84 * -0.5 * fVar57 * fVar57 * fVar57;
    fVar158 = auVar126._0_4_ * fVar57;
    fVar177 = auVar126._4_4_ * fVar57;
    fVar178 = auVar126._8_4_ * fVar57;
    fVar179 = auVar126._12_4_ * fVar57;
    auVar239._0_4_ = auVar12._0_4_ * fVar84;
    auVar239._4_4_ = auVar12._4_4_ * fVar84;
    auVar239._8_4_ = auVar12._8_4_ * fVar84;
    auVar239._12_4_ = auVar12._12_4_ * fVar84;
    fVar84 = auVar10._0_4_;
    auVar200._0_4_ = auVar126._0_4_ * fVar84;
    auVar200._4_4_ = auVar126._4_4_ * fVar84;
    auVar200._8_4_ = auVar126._8_4_ * fVar84;
    auVar200._12_4_ = auVar126._12_4_ * fVar84;
    auVar126 = vsubps_avx(auVar239,auVar200);
    auVar10 = vrcpss_avx(auVar62,auVar62);
    auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
    fVar86 = auVar10._0_4_ * auVar9._0_4_;
    auVar9 = vdpps_avx(auVar13,auVar13,0x7f);
    fVar87 = auVar9._0_4_;
    auVar62 = ZEXT416((uint)fVar87);
    auVar10 = vrsqrtss_avx(auVar62,auVar62);
    fVar84 = auVar10._0_4_;
    fVar84 = fVar84 * 1.5 + fVar87 * -0.5 * fVar84 * fVar84 * fVar84;
    fVar244 = fVar84 * auVar13._0_4_;
    fVar257 = fVar84 * auVar13._4_4_;
    fVar258 = fVar84 * auVar13._8_4_;
    fVar259 = fVar84 * auVar13._12_4_;
    auVar10 = vdpps_avx(auVar13,auVar14,0x7f);
    auVar182._0_4_ = fVar87 * auVar14._0_4_;
    auVar182._4_4_ = fVar87 * auVar14._4_4_;
    auVar182._8_4_ = fVar87 * auVar14._8_4_;
    auVar182._12_4_ = fVar87 * auVar14._12_4_;
    fVar87 = auVar10._0_4_;
    auVar147._0_4_ = fVar87 * auVar13._0_4_;
    auVar147._4_4_ = fVar87 * auVar13._4_4_;
    auVar147._8_4_ = fVar87 * auVar13._8_4_;
    auVar147._12_4_ = fVar87 * auVar13._12_4_;
    auVar12 = vsubps_avx(auVar182,auVar147);
    auVar10 = vrcpss_avx(auVar62,auVar62);
    auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
    fVar87 = auVar9._0_4_ * auVar10._0_4_;
    auVar9 = vshufps_avx(auVar108,auVar108,0xff);
    auVar213._0_4_ = auVar9._0_4_ * fVar158;
    auVar213._4_4_ = auVar9._4_4_ * fVar177;
    auVar213._8_4_ = auVar9._8_4_ * fVar178;
    auVar213._12_4_ = auVar9._12_4_ * fVar179;
    local_520 = vsubps_avx(auVar108,auVar213);
    auVar10 = vshufps_avx(auVar90,auVar90,0xff);
    auVar162._0_4_ = auVar10._0_4_ * fVar158 + fVar57 * auVar126._0_4_ * fVar86 * auVar9._0_4_;
    auVar162._4_4_ = auVar10._4_4_ * fVar177 + fVar57 * auVar126._4_4_ * fVar86 * auVar9._4_4_;
    auVar162._8_4_ = auVar10._8_4_ * fVar178 + fVar57 * auVar126._8_4_ * fVar86 * auVar9._8_4_;
    auVar162._12_4_ = auVar10._12_4_ * fVar179 + fVar57 * auVar126._12_4_ * fVar86 * auVar9._12_4_;
    auVar126 = vsubps_avx(auVar90,auVar162);
    local_530._0_4_ = auVar213._0_4_ + auVar108._0_4_;
    local_530._4_4_ = auVar213._4_4_ + auVar108._4_4_;
    fStack_528 = auVar213._8_4_ + auVar108._8_4_;
    fStack_524 = auVar213._12_4_ + auVar108._12_4_;
    auVar9 = vshufps_avx(auVar248,auVar248,0xff);
    auVar110._0_4_ = fVar244 * auVar9._0_4_;
    auVar110._4_4_ = fVar257 * auVar9._4_4_;
    auVar110._8_4_ = fVar258 * auVar9._8_4_;
    auVar110._12_4_ = fVar259 * auVar9._12_4_;
    local_540 = vsubps_avx(auVar248,auVar110);
    auVar10 = vshufps_avx(auVar61,auVar61,0xff);
    auVar92._0_4_ = fVar244 * auVar10._0_4_ + auVar9._0_4_ * fVar84 * auVar12._0_4_ * fVar87;
    auVar92._4_4_ = fVar257 * auVar10._4_4_ + auVar9._4_4_ * fVar84 * auVar12._4_4_ * fVar87;
    auVar92._8_4_ = fVar258 * auVar10._8_4_ + auVar9._8_4_ * fVar84 * auVar12._8_4_ * fVar87;
    auVar92._12_4_ = fVar259 * auVar10._12_4_ + auVar9._12_4_ * fVar84 * auVar12._12_4_ * fVar87;
    auVar9 = vsubps_avx(auVar61,auVar92);
    fVar158 = auVar248._0_4_ + auVar110._0_4_;
    fVar177 = auVar248._4_4_ + auVar110._4_4_;
    fVar178 = auVar248._8_4_ + auVar110._8_4_;
    fVar179 = auVar248._12_4_ + auVar110._12_4_;
    local_550._0_4_ = local_520._0_4_ + auVar126._0_4_ * 0.33333334;
    local_550._4_4_ = local_520._4_4_ + auVar126._4_4_ * 0.33333334;
    local_550._8_4_ = local_520._8_4_ + auVar126._8_4_ * 0.33333334;
    local_550._12_4_ = local_520._12_4_ + auVar126._12_4_ * 0.33333334;
    auVar93._0_4_ = auVar9._0_4_ * 0.33333334;
    auVar93._4_4_ = auVar9._4_4_ * 0.33333334;
    auVar93._8_4_ = auVar9._8_4_ * 0.33333334;
    auVar93._12_4_ = auVar9._12_4_ * 0.33333334;
    local_560 = vsubps_avx(local_540,auVar93);
    local_500 = vsubps_avx(local_520,auVar63);
    auVar9 = vshufps_avx(local_500,local_500,0x55);
    auVar10 = vshufps_avx(local_500,local_500,0xaa);
    aVar2 = pre->ray_space[k].vy.field_0;
    fVar57 = pre->ray_space[k].vz.field_0.m128[0];
    fVar84 = pre->ray_space[k].vz.field_0.m128[1];
    fVar86 = pre->ray_space[k].vz.field_0.m128[2];
    fVar87 = pre->ray_space[k].vz.field_0.m128[3];
    auVar94._0_4_ = fVar57 * auVar10._0_4_;
    auVar94._4_4_ = fVar84 * auVar10._4_4_;
    auVar94._8_4_ = fVar86 * auVar10._8_4_;
    auVar94._12_4_ = fVar87 * auVar10._12_4_;
    auVar126 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar2,auVar9);
    local_510 = vsubps_avx(local_550,auVar63);
    auVar9 = vshufps_avx(local_510,local_510,0x55);
    auVar10 = vshufps_avx(local_510,local_510,0xaa);
    auVar278._0_4_ = fVar57 * auVar10._0_4_;
    auVar278._4_4_ = fVar84 * auVar10._4_4_;
    auVar278._8_4_ = fVar86 * auVar10._8_4_;
    auVar278._12_4_ = fVar87 * auVar10._12_4_;
    auVar10 = vfmadd231ps_fma(auVar278,(undefined1  [16])aVar2,auVar9);
    local_3d0 = vsubps_avx(local_560,auVar63);
    auVar9 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar246._0_4_ = fVar57 * auVar9._0_4_;
    auVar246._4_4_ = fVar84 * auVar9._4_4_;
    auVar246._8_4_ = fVar86 * auVar9._8_4_;
    auVar246._12_4_ = fVar87 * auVar9._12_4_;
    auVar9 = vshufps_avx(local_3d0,local_3d0,0x55);
    auVar12 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar2,auVar9);
    local_3e0 = vsubps_avx(local_540,auVar63);
    auVar9 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar261._0_4_ = fVar57 * auVar9._0_4_;
    auVar261._4_4_ = fVar84 * auVar9._4_4_;
    auVar261._8_4_ = fVar86 * auVar9._8_4_;
    auVar261._12_4_ = fVar87 * auVar9._12_4_;
    auVar9 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar13 = vfmadd231ps_fma(auVar261,(undefined1  [16])aVar2,auVar9);
    local_3f0 = vsubps_avx(_local_530,auVar63);
    auVar9 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar148._0_4_ = fVar57 * auVar9._0_4_;
    auVar148._4_4_ = fVar84 * auVar9._4_4_;
    auVar148._8_4_ = fVar86 * auVar9._8_4_;
    auVar148._12_4_ = fVar87 * auVar9._12_4_;
    auVar9 = vshufps_avx(local_3f0,local_3f0,0x55);
    auVar14 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar2,auVar9);
    local_570._0_4_ = (fVar118 + auVar162._0_4_) * 0.33333334 + (float)local_530._0_4_;
    local_570._4_4_ = (fVar85 + auVar162._4_4_) * 0.33333334 + (float)local_530._4_4_;
    fStack_568 = (fVar60 + auVar162._8_4_) * 0.33333334 + fStack_528;
    fStack_564 = (fVar159 + auVar162._12_4_) * 0.33333334 + fStack_524;
    local_400 = vsubps_avx(_local_570,auVar63);
    auVar9 = vshufps_avx(local_400,local_400,0xaa);
    auVar201._0_4_ = auVar9._0_4_ * fVar57;
    auVar201._4_4_ = auVar9._4_4_ * fVar84;
    auVar201._8_4_ = auVar9._8_4_ * fVar86;
    auVar201._12_4_ = auVar9._12_4_ * fVar87;
    auVar9 = vshufps_avx(local_400,local_400,0x55);
    auVar62 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar2,auVar9);
    auVar214._0_4_ = (fVar59 + auVar92._0_4_) * 0.33333334;
    auVar214._4_4_ = (fVar226 + auVar92._4_4_) * 0.33333334;
    auVar214._8_4_ = (fVar133 + auVar92._8_4_) * 0.33333334;
    auVar214._12_4_ = (fVar143 + auVar92._12_4_) * 0.33333334;
    auVar43._4_4_ = fVar177;
    auVar43._0_4_ = fVar158;
    auVar43._8_4_ = fVar178;
    auVar43._12_4_ = fVar179;
    _local_580 = vsubps_avx(auVar43,auVar214);
    local_410 = vsubps_avx(_local_580,auVar63);
    auVar9 = vshufps_avx(local_410,local_410,0xaa);
    auVar215._0_4_ = auVar9._0_4_ * fVar57;
    auVar215._4_4_ = auVar9._4_4_ * fVar84;
    auVar215._8_4_ = auVar9._8_4_ * fVar86;
    auVar215._12_4_ = auVar9._12_4_ * fVar87;
    auVar9 = vshufps_avx(local_410,local_410,0x55);
    auVar108 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar2,auVar9);
    local_420 = vsubps_avx(auVar43,auVar63);
    auVar9 = vshufps_avx(local_420,local_420,0xaa);
    auVar65._0_4_ = fVar57 * auVar9._0_4_;
    auVar65._4_4_ = fVar84 * auVar9._4_4_;
    auVar65._8_4_ = fVar86 * auVar9._8_4_;
    auVar65._12_4_ = fVar87 * auVar9._12_4_;
    auVar9 = vshufps_avx(local_420,local_420,0x55);
    auVar9 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar9);
    auVar163._4_4_ = local_500._0_4_;
    auVar163._0_4_ = local_500._0_4_;
    auVar163._8_4_ = local_500._0_4_;
    auVar163._12_4_ = local_500._0_4_;
    aVar2 = pre->ray_space[k].vx.field_0;
    auVar63 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar2,auVar163);
    auVar164._4_4_ = local_510._0_4_;
    auVar164._0_4_ = local_510._0_4_;
    auVar164._8_4_ = local_510._0_4_;
    auVar164._12_4_ = local_510._0_4_;
    auVar248 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar164);
    uVar58 = local_3d0._0_4_;
    auVar165._4_4_ = uVar58;
    auVar165._0_4_ = uVar58;
    auVar165._8_4_ = uVar58;
    auVar165._12_4_ = uVar58;
    auVar61 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar165);
    uVar58 = local_3e0._0_4_;
    auVar166._4_4_ = uVar58;
    auVar166._0_4_ = uVar58;
    auVar166._8_4_ = uVar58;
    auVar166._12_4_ = uVar58;
    auVar90 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar166);
    uVar58 = local_3f0._0_4_;
    auVar167._4_4_ = uVar58;
    auVar167._0_4_ = uVar58;
    auVar167._8_4_ = uVar58;
    auVar167._12_4_ = uVar58;
    auVar119 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar2,auVar167);
    uVar58 = local_400._0_4_;
    auVar168._4_4_ = uVar58;
    auVar168._0_4_ = uVar58;
    auVar168._8_4_ = uVar58;
    auVar168._12_4_ = uVar58;
    auVar62 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar168);
    uVar58 = local_410._0_4_;
    auVar169._4_4_ = uVar58;
    auVar169._0_4_ = uVar58;
    auVar169._8_4_ = uVar58;
    auVar169._12_4_ = uVar58;
    auVar108 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar2,auVar169);
    uVar58 = local_420._0_4_;
    auVar170._4_4_ = uVar58;
    auVar170._0_4_ = uVar58;
    auVar170._8_4_ = uVar58;
    auVar170._12_4_ = uVar58;
    auVar135 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar170);
    local_4e0 = vmovlhps_avx(auVar63,auVar119);
    auVar12 = vmovlhps_avx(auVar248,auVar62);
    auVar13 = vmovlhps_avx(auVar61,auVar108);
    auVar14 = vmovlhps_avx(auVar90,auVar135);
    auVar9 = vminps_avx(local_4e0,auVar12);
    auVar10 = vminps_avx(auVar13,auVar14);
    auVar126 = vminps_avx(auVar9,auVar10);
    auVar9 = vmaxps_avx(local_4e0,auVar12);
    auVar10 = vmaxps_avx(auVar13,auVar14);
    auVar9 = vmaxps_avx(auVar9,auVar10);
    auVar10 = vshufpd_avx(auVar126,auVar126,3);
    auVar126 = vminps_avx(auVar126,auVar10);
    auVar10 = vshufpd_avx(auVar9,auVar9,3);
    auVar10 = vmaxps_avx(auVar9,auVar10);
    auVar9 = vandps_avx(local_4f0,auVar126);
    auVar10 = vandps_avx(local_4f0,auVar10);
    auVar9 = vmaxps_avx(auVar9,auVar10);
    auVar10 = vmovshdup_avx(auVar9);
    auVar9 = vmaxss_avx(auVar10,auVar9);
    local_1c0 = auVar9._0_4_ * 9.536743e-07;
    auVar183._8_8_ = auVar63._0_8_;
    auVar183._0_8_ = auVar63._0_8_;
    auVar229._8_8_ = auVar248._0_8_;
    auVar229._0_8_ = auVar248._0_8_;
    auVar247._0_8_ = auVar61._0_8_;
    auVar247._8_8_ = auVar247._0_8_;
    auVar262._0_8_ = auVar90._0_8_;
    auVar262._8_8_ = auVar262._0_8_;
    local_390 = ZEXT416((uint)local_1c0);
    fStack_1bc = local_1c0;
    fStack_1b8 = local_1c0;
    fStack_1b4 = local_1c0;
    fStack_1b0 = local_1c0;
    fStack_1ac = local_1c0;
    fStack_1a8 = local_1c0;
    fStack_1a4 = local_1c0;
    fStack_1d8 = -local_1c0;
    local_1e0 = -local_1c0;
    fStack_1dc = -local_1c0;
    fStack_1d4 = fStack_1d8;
    fStack_1d0 = fStack_1d8;
    fStack_1cc = fStack_1d8;
    fStack_1c8 = fStack_1d8;
    fStack_1c4 = fStack_1d8;
    local_320 = uVar47;
    uStack_31c = uVar47;
    uStack_318 = uVar47;
    uStack_314 = uVar47;
    uStack_310 = uVar47;
    uStack_30c = uVar47;
    uStack_308 = uVar47;
    uStack_304 = uVar47;
    local_340 = uVar4;
    uStack_33c = uVar4;
    uStack_338 = uVar4;
    uStack_334 = uVar4;
    uStack_330 = uVar4;
    uStack_32c = uVar4;
    uStack_328 = uVar4;
    uStack_324 = uVar4;
    uVar56 = 0;
    fVar57 = *(float *)(ray + k * 4 + 0x60);
    local_3a0 = vsubps_avx(auVar12,local_4e0);
    local_3b0 = vsubps_avx(auVar13,auVar12);
    local_3c0 = vsubps_avx(auVar14,auVar13);
    local_440 = vsubps_avx(_local_530,local_520);
    local_450 = vsubps_avx(_local_570,local_550);
    local_460 = vsubps_avx(_local_580,local_560);
    auVar44._4_4_ = fVar177;
    auVar44._0_4_ = fVar158;
    auVar44._8_4_ = fVar178;
    auVar44._12_4_ = fVar179;
    _local_470 = vsubps_avx(auVar44,local_540);
    auVar66 = ZEXT816(0x3f80000000000000);
    local_430 = auVar66;
LAB_016297f9:
    auVar9 = vshufps_avx(auVar66,auVar66,0x50);
    auVar279._8_4_ = 0x3f800000;
    auVar279._0_8_ = 0x3f8000003f800000;
    auVar279._12_4_ = 0x3f800000;
    auVar282._16_4_ = 0x3f800000;
    auVar282._0_16_ = auVar279;
    auVar282._20_4_ = 0x3f800000;
    auVar282._24_4_ = 0x3f800000;
    auVar282._28_4_ = 0x3f800000;
    auVar10 = vsubps_avx(auVar279,auVar9);
    fVar84 = auVar9._0_4_;
    fVar133 = auVar119._0_4_;
    auVar67._0_4_ = fVar133 * fVar84;
    fVar86 = auVar9._4_4_;
    fVar143 = auVar119._4_4_;
    auVar67._4_4_ = fVar143 * fVar86;
    fVar87 = auVar9._8_4_;
    auVar67._8_4_ = fVar133 * fVar87;
    fVar118 = auVar9._12_4_;
    auVar67._12_4_ = fVar143 * fVar118;
    fVar244 = auVar62._0_4_;
    auVar171._0_4_ = fVar244 * fVar84;
    fVar257 = auVar62._4_4_;
    auVar171._4_4_ = fVar257 * fVar86;
    auVar171._8_4_ = fVar244 * fVar87;
    auVar171._12_4_ = fVar257 * fVar118;
    fVar196 = auVar108._0_4_;
    auVar137._0_4_ = fVar196 * fVar84;
    fVar209 = auVar108._4_4_;
    auVar137._4_4_ = fVar209 * fVar86;
    auVar137._8_4_ = fVar196 * fVar87;
    auVar137._12_4_ = fVar209 * fVar118;
    fVar210 = auVar135._0_4_;
    auVar111._0_4_ = fVar210 * fVar84;
    fVar225 = auVar135._4_4_;
    auVar111._4_4_ = fVar225 * fVar86;
    auVar111._8_4_ = fVar210 * fVar87;
    auVar111._12_4_ = fVar225 * fVar118;
    auVar248 = vfmadd231ps_fma(auVar67,auVar10,auVar183);
    auVar61 = vfmadd231ps_fma(auVar171,auVar10,auVar229);
    auVar90 = vfmadd231ps_fma(auVar137,auVar10,auVar247);
    auVar240 = vfmadd231ps_fma(auVar111,auVar262,auVar10);
    auVar9 = vmovshdup_avx(local_430);
    fVar84 = local_430._0_4_;
    fStack_288 = (auVar9._0_4_ - fVar84) * 0.04761905;
    auVar223._4_4_ = fVar84;
    auVar223._0_4_ = fVar84;
    auVar223._8_4_ = fVar84;
    auVar223._12_4_ = fVar84;
    auVar223._16_4_ = fVar84;
    auVar223._20_4_ = fVar84;
    auVar223._24_4_ = fVar84;
    auVar223._28_4_ = fVar84;
    auVar104._0_8_ = auVar9._0_8_;
    auVar104._8_8_ = auVar104._0_8_;
    auVar104._16_8_ = auVar104._0_8_;
    auVar104._24_8_ = auVar104._0_8_;
    auVar79 = vsubps_avx(auVar104,auVar223);
    uVar58 = auVar248._0_4_;
    auVar275._4_4_ = uVar58;
    auVar275._0_4_ = uVar58;
    auVar275._8_4_ = uVar58;
    auVar275._12_4_ = uVar58;
    auVar275._16_4_ = uVar58;
    auVar275._20_4_ = uVar58;
    auVar275._24_4_ = uVar58;
    auVar275._28_4_ = uVar58;
    auVar9 = vmovshdup_avx(auVar248);
    uVar88 = auVar9._0_8_;
    auVar268._8_8_ = uVar88;
    auVar268._0_8_ = uVar88;
    auVar268._16_8_ = uVar88;
    auVar268._24_8_ = uVar88;
    fVar226 = auVar61._0_4_;
    auVar254._4_4_ = fVar226;
    auVar254._0_4_ = fVar226;
    auVar254._8_4_ = fVar226;
    auVar254._12_4_ = fVar226;
    auVar254._16_4_ = fVar226;
    auVar254._20_4_ = fVar226;
    auVar254._24_4_ = fVar226;
    auVar254._28_4_ = fVar226;
    auVar10 = vmovshdup_avx(auVar61);
    auVar105._0_8_ = auVar10._0_8_;
    auVar105._8_8_ = auVar105._0_8_;
    auVar105._16_8_ = auVar105._0_8_;
    auVar105._24_8_ = auVar105._0_8_;
    fVar59 = auVar90._0_4_;
    auVar188._4_4_ = fVar59;
    auVar188._0_4_ = fVar59;
    auVar188._8_4_ = fVar59;
    auVar188._12_4_ = fVar59;
    auVar188._16_4_ = fVar59;
    auVar188._20_4_ = fVar59;
    auVar188._24_4_ = fVar59;
    auVar188._28_4_ = fVar59;
    auVar126 = vmovshdup_avx(auVar90);
    auVar207._0_8_ = auVar126._0_8_;
    auVar207._8_8_ = auVar207._0_8_;
    auVar207._16_8_ = auVar207._0_8_;
    auVar207._24_8_ = auVar207._0_8_;
    fVar159 = auVar240._0_4_;
    auVar63 = vmovshdup_avx(auVar240);
    auVar89 = vfmadd132ps_fma(auVar79,auVar223,_DAT_01faff20);
    auVar79 = vsubps_avx(auVar282,ZEXT1632(auVar89));
    fVar84 = auVar89._0_4_;
    fVar86 = auVar89._4_4_;
    auVar16._4_4_ = fVar226 * fVar86;
    auVar16._0_4_ = fVar226 * fVar84;
    fVar87 = auVar89._8_4_;
    auVar16._8_4_ = fVar226 * fVar87;
    fVar118 = auVar89._12_4_;
    auVar16._12_4_ = fVar226 * fVar118;
    auVar16._16_4_ = fVar226 * 0.0;
    auVar16._20_4_ = fVar226 * 0.0;
    auVar16._24_4_ = fVar226 * 0.0;
    auVar16._28_4_ = 0x3f800000;
    auVar89 = vfmadd231ps_fma(auVar16,auVar79,auVar275);
    fVar85 = auVar10._0_4_;
    fVar60 = auVar10._4_4_;
    auVar15._4_4_ = fVar60 * fVar86;
    auVar15._0_4_ = fVar85 * fVar84;
    auVar15._8_4_ = fVar85 * fVar87;
    auVar15._12_4_ = fVar60 * fVar118;
    auVar15._16_4_ = fVar85 * 0.0;
    auVar15._20_4_ = fVar60 * 0.0;
    auVar15._24_4_ = fVar85 * 0.0;
    auVar15._28_4_ = uVar58;
    auVar134 = vfmadd231ps_fma(auVar15,auVar79,auVar268);
    auVar11._4_4_ = fVar59 * fVar86;
    auVar11._0_4_ = fVar59 * fVar84;
    auVar11._8_4_ = fVar59 * fVar87;
    auVar11._12_4_ = fVar59 * fVar118;
    auVar11._16_4_ = fVar59 * 0.0;
    auVar11._20_4_ = fVar59 * 0.0;
    auVar11._24_4_ = fVar59 * 0.0;
    auVar11._28_4_ = auVar9._4_4_;
    auVar123 = vfmadd231ps_fma(auVar11,auVar79,auVar254);
    fVar85 = auVar126._0_4_;
    fVar60 = auVar126._4_4_;
    auVar17._4_4_ = fVar60 * fVar86;
    auVar17._0_4_ = fVar85 * fVar84;
    auVar17._8_4_ = fVar85 * fVar87;
    auVar17._12_4_ = fVar60 * fVar118;
    auVar17._16_4_ = fVar85 * 0.0;
    auVar17._20_4_ = fVar60 * 0.0;
    auVar17._24_4_ = fVar85 * 0.0;
    auVar17._28_4_ = fVar226;
    auVar144 = vfmadd231ps_fma(auVar17,auVar79,auVar105);
    auVar9 = vshufps_avx(auVar248,auVar248,0xaa);
    local_6c0._8_8_ = auVar9._0_8_;
    local_6c0._0_8_ = local_6c0._8_8_;
    local_6c0._16_8_ = local_6c0._8_8_;
    local_6c0._24_8_ = local_6c0._8_8_;
    auVar10 = vshufps_avx(auVar248,auVar248,0xff);
    uStack_738 = auVar10._0_8_;
    local_740 = (undefined1  [8])uStack_738;
    uStack_730 = uStack_738;
    uStack_728 = uStack_738;
    auVar18._4_4_ = fVar159 * fVar86;
    auVar18._0_4_ = fVar159 * fVar84;
    auVar18._8_4_ = fVar159 * fVar87;
    auVar18._12_4_ = fVar159 * fVar118;
    auVar18._16_4_ = fVar159 * 0.0;
    auVar18._20_4_ = fVar159 * 0.0;
    auVar18._24_4_ = fVar159 * 0.0;
    auVar18._28_4_ = fVar159;
    auVar248 = vfmadd231ps_fma(auVar18,auVar79,auVar188);
    auVar10 = vshufps_avx(auVar61,auVar61,0xaa);
    auVar189._0_8_ = auVar10._0_8_;
    auVar189._8_8_ = auVar189._0_8_;
    auVar189._16_8_ = auVar189._0_8_;
    auVar189._24_8_ = auVar189._0_8_;
    auVar126 = vshufps_avx(auVar61,auVar61,0xff);
    local_600._8_8_ = auVar126._0_8_;
    local_600._0_8_ = local_600._8_8_;
    local_600._16_8_ = local_600._8_8_;
    local_600._24_8_ = local_600._8_8_;
    fVar85 = auVar63._0_4_;
    fVar60 = auVar63._4_4_;
    auVar19._4_4_ = fVar60 * fVar86;
    auVar19._0_4_ = fVar85 * fVar84;
    auVar19._8_4_ = fVar85 * fVar87;
    auVar19._12_4_ = fVar60 * fVar118;
    auVar19._16_4_ = fVar85 * 0.0;
    auVar19._20_4_ = fVar60 * 0.0;
    auVar19._24_4_ = fVar85 * 0.0;
    auVar19._28_4_ = auVar9._4_4_;
    auVar145 = vfmadd231ps_fma(auVar19,auVar79,auVar207);
    auVar256._28_4_ = fVar60;
    auVar256._0_28_ =
         ZEXT1628(CONCAT412(auVar123._12_4_ * fVar118,
                            CONCAT48(auVar123._8_4_ * fVar87,
                                     CONCAT44(auVar123._4_4_ * fVar86,auVar123._0_4_ * fVar84))));
    auVar89 = vfmadd231ps_fma(auVar256,auVar79,ZEXT1632(auVar89));
    fVar85 = auVar126._4_4_;
    auVar20._28_4_ = fVar85;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar144._12_4_ * fVar118,
                            CONCAT48(auVar144._8_4_ * fVar87,
                                     CONCAT44(auVar144._4_4_ * fVar86,auVar144._0_4_ * fVar84))));
    auVar134 = vfmadd231ps_fma(auVar20,auVar79,ZEXT1632(auVar134));
    auVar9 = vshufps_avx(auVar90,auVar90,0xaa);
    uVar88 = auVar9._0_8_;
    auVar176._8_8_ = uVar88;
    auVar176._0_8_ = uVar88;
    auVar176._16_8_ = uVar88;
    auVar176._24_8_ = uVar88;
    auVar63 = vshufps_avx(auVar90,auVar90,0xff);
    uVar88 = auVar63._0_8_;
    auVar283._8_8_ = uVar88;
    auVar283._0_8_ = uVar88;
    auVar283._16_8_ = uVar88;
    auVar283._24_8_ = uVar88;
    auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar248._12_4_ * fVar118,
                                                 CONCAT48(auVar248._8_4_ * fVar87,
                                                          CONCAT44(auVar248._4_4_ * fVar86,
                                                                   auVar248._0_4_ * fVar84)))),
                              auVar79,ZEXT1632(auVar123));
    auVar248 = vshufps_avx(auVar240,auVar240,0xaa);
    auVar61 = vshufps_avx(auVar240,auVar240,0xff);
    auVar240 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar145._12_4_,
                                                  CONCAT48(fVar87 * auVar145._8_4_,
                                                           CONCAT44(fVar86 * auVar145._4_4_,
                                                                    fVar84 * auVar145._0_4_)))),
                               auVar79,ZEXT1632(auVar144));
    auVar123 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar90._12_4_,
                                                  CONCAT48(fVar87 * auVar90._8_4_,
                                                           CONCAT44(fVar86 * auVar90._4_4_,
                                                                    fVar84 * auVar90._0_4_)))),
                               auVar79,ZEXT1632(auVar89));
    auVar16 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar89));
    auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar240._12_4_,
                                                 CONCAT48(fVar87 * auVar240._8_4_,
                                                          CONCAT44(fVar86 * auVar240._4_4_,
                                                                   fVar84 * auVar240._0_4_)))),
                              auVar79,ZEXT1632(auVar134));
    auVar80 = vsubps_avx(ZEXT1632(auVar240),ZEXT1632(auVar134));
    fVar60 = auVar80._28_4_;
    auVar255._0_4_ = fStack_288 * auVar16._0_4_ * 3.0;
    auVar255._4_4_ = fStack_288 * auVar16._4_4_ * 3.0;
    auVar255._8_4_ = fStack_288 * auVar16._8_4_ * 3.0;
    auVar255._12_4_ = fStack_288 * auVar16._12_4_ * 3.0;
    auVar255._16_4_ = fStack_288 * auVar16._16_4_ * 3.0;
    auVar255._20_4_ = fStack_288 * auVar16._20_4_ * 3.0;
    auVar255._24_4_ = fStack_288 * auVar16._24_4_ * 3.0;
    auVar255._28_4_ = 0;
    local_5a0._0_4_ = fStack_288 * auVar80._0_4_ * 3.0;
    local_5a0._4_4_ = fStack_288 * auVar80._4_4_ * 3.0;
    fStack_598 = fStack_288 * auVar80._8_4_ * 3.0;
    fStack_594 = fStack_288 * auVar80._12_4_ * 3.0;
    fStack_590 = fStack_288 * auVar80._16_4_ * 3.0;
    fStack_58c = fStack_288 * auVar80._20_4_ * 3.0;
    fStack_588 = fStack_288 * auVar80._24_4_ * 3.0;
    fStack_584 = fVar60;
    fVar159 = auVar10._0_4_;
    fVar59 = auVar10._4_4_;
    auVar21._4_4_ = fVar59 * fVar86;
    auVar21._0_4_ = fVar159 * fVar84;
    auVar21._8_4_ = fVar159 * fVar87;
    auVar21._12_4_ = fVar59 * fVar118;
    auVar21._16_4_ = fVar159 * 0.0;
    auVar21._20_4_ = fVar59 * 0.0;
    auVar21._24_4_ = fVar159 * 0.0;
    auVar21._28_4_ = fVar60;
    auVar10 = vfmadd231ps_fma(auVar21,auVar79,local_6c0);
    fVar159 = auVar126._0_4_;
    auVar22._4_4_ = fVar85 * fVar86;
    auVar22._0_4_ = fVar159 * fVar84;
    auVar22._8_4_ = fVar159 * fVar87;
    auVar22._12_4_ = fVar85 * fVar118;
    auVar22._16_4_ = fVar159 * 0.0;
    auVar22._20_4_ = fVar85 * 0.0;
    auVar22._24_4_ = fVar159 * 0.0;
    auVar22._28_4_ = 0;
    auVar126 = vfmadd231ps_fma(auVar22,auVar79,_local_740);
    fVar85 = auVar9._0_4_;
    fVar159 = auVar9._4_4_;
    auVar23._4_4_ = fVar159 * fVar86;
    auVar23._0_4_ = fVar85 * fVar84;
    auVar23._8_4_ = fVar85 * fVar87;
    auVar23._12_4_ = fVar159 * fVar118;
    auVar23._16_4_ = fVar85 * 0.0;
    auVar23._20_4_ = fVar159 * 0.0;
    auVar23._24_4_ = fVar85 * 0.0;
    auVar23._28_4_ = auVar16._28_4_;
    auVar9 = vfmadd231ps_fma(auVar23,auVar79,auVar189);
    fVar85 = auVar63._0_4_;
    fVar226 = auVar63._4_4_;
    auVar24._4_4_ = fVar226 * fVar86;
    auVar24._0_4_ = fVar85 * fVar84;
    auVar24._8_4_ = fVar85 * fVar87;
    auVar24._12_4_ = fVar226 * fVar118;
    auVar24._16_4_ = fVar85 * 0.0;
    auVar24._20_4_ = fVar226 * 0.0;
    auVar24._24_4_ = fVar85 * 0.0;
    auVar24._28_4_ = fVar59;
    auVar63 = vfmadd231ps_fma(auVar24,auVar79,local_600);
    auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar123));
    fVar85 = auVar248._0_4_;
    fVar159 = auVar248._4_4_;
    auVar25._4_4_ = fVar159 * fVar86;
    auVar25._0_4_ = fVar85 * fVar84;
    auVar25._8_4_ = fVar85 * fVar87;
    auVar25._12_4_ = fVar159 * fVar118;
    auVar25._16_4_ = fVar85 * 0.0;
    auVar25._20_4_ = fVar159 * 0.0;
    auVar25._24_4_ = fVar85 * 0.0;
    auVar25._28_4_ = fVar159;
    auVar248 = vfmadd231ps_fma(auVar25,auVar79,auVar176);
    auVar18 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar90));
    fVar85 = auVar61._0_4_;
    fVar159 = auVar61._4_4_;
    auVar26._4_4_ = fVar159 * fVar86;
    auVar26._0_4_ = fVar85 * fVar84;
    auVar26._8_4_ = fVar85 * fVar87;
    auVar26._12_4_ = fVar159 * fVar118;
    auVar26._16_4_ = fVar85 * 0.0;
    auVar26._20_4_ = fVar159 * 0.0;
    auVar26._24_4_ = fVar85 * 0.0;
    auVar26._28_4_ = fVar159;
    auVar61 = vfmadd231ps_fma(auVar26,auVar79,auVar283);
    auVar27._28_4_ = fVar226;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar9._12_4_ * fVar118,
                            CONCAT48(auVar9._8_4_ * fVar87,
                                     CONCAT44(auVar9._4_4_ * fVar86,auVar9._0_4_ * fVar84))));
    auVar10 = vfmadd231ps_fma(auVar27,auVar79,ZEXT1632(auVar10));
    auVar126 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar63._12_4_,
                                                  CONCAT48(fVar87 * auVar63._8_4_,
                                                           CONCAT44(fVar86 * auVar63._4_4_,
                                                                    fVar84 * auVar63._0_4_)))),
                               auVar79,ZEXT1632(auVar126));
    auVar106._0_4_ = auVar123._0_4_ + auVar255._0_4_;
    auVar106._4_4_ = auVar123._4_4_ + auVar255._4_4_;
    auVar106._8_4_ = auVar123._8_4_ + auVar255._8_4_;
    auVar106._12_4_ = auVar123._12_4_ + auVar255._12_4_;
    auVar106._16_4_ = auVar255._16_4_ + 0.0;
    auVar106._20_4_ = auVar255._20_4_ + 0.0;
    auVar106._24_4_ = auVar255._24_4_ + 0.0;
    auVar106._28_4_ = 0;
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar248._12_4_ * fVar118,
                                                CONCAT48(auVar248._8_4_ * fVar87,
                                                         CONCAT44(auVar248._4_4_ * fVar86,
                                                                  auVar248._0_4_ * fVar84)))),
                             auVar79,ZEXT1632(auVar9));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar61._12_4_ * fVar118,
                                                 CONCAT48(auVar61._8_4_ * fVar87,
                                                          CONCAT44(auVar61._4_4_ * fVar86,
                                                                   auVar61._0_4_ * fVar84)))),
                              auVar79,ZEXT1632(auVar63));
    auVar248 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar9._12_4_,
                                                  CONCAT48(fVar87 * auVar9._8_4_,
                                                           CONCAT44(fVar86 * auVar9._4_4_,
                                                                    fVar84 * auVar9._0_4_)))),
                               auVar79,ZEXT1632(auVar10));
    auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar63._12_4_ * fVar118,
                                                 CONCAT48(auVar63._8_4_ * fVar87,
                                                          CONCAT44(auVar63._4_4_ * fVar86,
                                                                   auVar63._0_4_ * fVar84)))),
                              ZEXT1632(auVar126),auVar79);
    auVar79 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar16 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar126));
    auVar276._0_4_ = fStack_288 * auVar79._0_4_ * 3.0;
    auVar276._4_4_ = fStack_288 * auVar79._4_4_ * 3.0;
    auVar276._8_4_ = fStack_288 * auVar79._8_4_ * 3.0;
    auVar276._12_4_ = fStack_288 * auVar79._12_4_ * 3.0;
    auVar276._16_4_ = fStack_288 * auVar79._16_4_ * 3.0;
    auVar276._20_4_ = fStack_288 * auVar79._20_4_ * 3.0;
    auVar276._24_4_ = fStack_288 * auVar79._24_4_ * 3.0;
    auVar276._28_4_ = 0;
    local_2a0 = fStack_288 * auVar16._0_4_ * 3.0;
    fStack_29c = fStack_288 * auVar16._4_4_ * 3.0;
    auVar28._4_4_ = fStack_29c;
    auVar28._0_4_ = local_2a0;
    fStack_298 = fStack_288 * auVar16._8_4_ * 3.0;
    auVar28._8_4_ = fStack_298;
    fStack_294 = fStack_288 * auVar16._12_4_ * 3.0;
    auVar28._12_4_ = fStack_294;
    fStack_290 = fStack_288 * auVar16._16_4_ * 3.0;
    auVar28._16_4_ = fStack_290;
    fStack_28c = fStack_288 * auVar16._20_4_ * 3.0;
    auVar28._20_4_ = fStack_28c;
    fStack_288 = fStack_288 * auVar16._24_4_ * 3.0;
    auVar28._24_4_ = fStack_288;
    auVar28._28_4_ = 0x40400000;
    auVar19 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar248));
    _local_4c0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar61));
    auVar79 = vsubps_avx(ZEXT1632(auVar248),ZEXT1632(auVar123));
    auVar16 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar90));
    auVar80 = vsubps_avx(auVar19,auVar17);
    fVar258 = auVar79._0_4_ + auVar80._0_4_;
    fVar259 = auVar79._4_4_ + auVar80._4_4_;
    fVar191 = auVar79._8_4_ + auVar80._8_4_;
    fVar192 = auVar79._12_4_ + auVar80._12_4_;
    fVar193 = auVar79._16_4_ + auVar80._16_4_;
    fVar194 = auVar79._20_4_ + auVar80._20_4_;
    fVar195 = auVar79._24_4_ + auVar80._24_4_;
    auVar15 = vsubps_avx(_local_4c0,auVar18);
    auVar81._0_4_ = auVar16._0_4_ + auVar15._0_4_;
    auVar81._4_4_ = auVar16._4_4_ + auVar15._4_4_;
    auVar81._8_4_ = auVar16._8_4_ + auVar15._8_4_;
    auVar81._12_4_ = auVar16._12_4_ + auVar15._12_4_;
    auVar81._16_4_ = auVar16._16_4_ + auVar15._16_4_;
    auVar81._20_4_ = auVar16._20_4_ + auVar15._20_4_;
    auVar81._24_4_ = auVar16._24_4_ + auVar15._24_4_;
    auVar81._28_4_ = auVar16._28_4_ + auVar15._28_4_;
    local_240 = ZEXT1632(auVar90);
    fVar84 = auVar90._0_4_;
    local_2c0 = (float)local_5a0._0_4_ + fVar84;
    fVar86 = auVar90._4_4_;
    fStack_2bc = (float)local_5a0._4_4_ + fVar86;
    fVar87 = auVar90._8_4_;
    fStack_2b8 = fStack_598 + fVar87;
    fVar118 = auVar90._12_4_;
    fStack_2b4 = fStack_594 + fVar118;
    fStack_2b0 = fStack_590 + 0.0;
    fStack_2ac = fStack_58c + 0.0;
    fStack_2a8 = fStack_588 + 0.0;
    local_200 = ZEXT1632(auVar123);
    auVar16 = vsubps_avx(local_200,auVar255);
    local_220 = vpermps_avx2(_DAT_01fec480,auVar16);
    auVar16 = vsubps_avx(local_240,_local_5a0);
    local_2e0 = vpermps_avx2(_DAT_01fec480,auVar16);
    local_260._0_4_ = auVar248._0_4_ + auVar276._0_4_;
    local_260._4_4_ = auVar248._4_4_ + auVar276._4_4_;
    local_260._8_4_ = auVar248._8_4_ + auVar276._8_4_;
    local_260._12_4_ = auVar248._12_4_ + auVar276._12_4_;
    local_260._16_4_ = auVar276._16_4_ + 0.0;
    local_260._20_4_ = auVar276._20_4_ + 0.0;
    local_260._24_4_ = auVar276._24_4_ + 0.0;
    local_260._28_4_ = 0;
    auVar224 = ZEXT3264(local_260);
    auVar256 = ZEXT1632(auVar248);
    auVar16 = vsubps_avx(auVar256,auVar276);
    _local_5a0 = vpermps_avx2(_DAT_01fec480,auVar16);
    fVar85 = auVar61._0_4_;
    local_2a0 = fVar85 + local_2a0;
    fVar159 = auVar61._4_4_;
    fStack_29c = fVar159 + fStack_29c;
    fVar59 = auVar61._8_4_;
    fStack_298 = fVar59 + fStack_298;
    fVar226 = auVar61._12_4_;
    fStack_294 = fVar226 + fStack_294;
    fStack_290 = fStack_290 + 0.0;
    fStack_28c = fStack_28c + 0.0;
    fStack_288 = fStack_288 + 0.0;
    auVar16 = vsubps_avx(ZEXT1632(auVar61),auVar28);
    local_280 = vpermps_avx2(_DAT_01fec480,auVar16);
    auVar29._4_4_ = fVar86 * fVar259;
    auVar29._0_4_ = fVar84 * fVar258;
    auVar29._8_4_ = fVar87 * fVar191;
    auVar29._12_4_ = fVar118 * fVar192;
    auVar29._16_4_ = fVar193 * 0.0;
    auVar29._20_4_ = fVar194 * 0.0;
    auVar29._24_4_ = fVar195 * 0.0;
    auVar29._28_4_ = auVar16._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar29,local_200,auVar81);
    fStack_2a4 = fVar60 + 0.0;
    auVar30._4_4_ = fStack_2bc * fVar259;
    auVar30._0_4_ = local_2c0 * fVar258;
    auVar30._8_4_ = fStack_2b8 * fVar191;
    auVar30._12_4_ = fStack_2b4 * fVar192;
    auVar30._16_4_ = fStack_2b0 * fVar193;
    auVar30._20_4_ = fStack_2ac * fVar194;
    auVar30._24_4_ = fStack_2a8 * fVar195;
    auVar30._28_4_ = 0;
    auVar10 = vfnmadd231ps_fma(auVar30,auVar81,auVar106);
    auVar31._4_4_ = local_2e0._4_4_ * fVar259;
    auVar31._0_4_ = local_2e0._0_4_ * fVar258;
    auVar31._8_4_ = local_2e0._8_4_ * fVar191;
    auVar31._12_4_ = local_2e0._12_4_ * fVar192;
    auVar31._16_4_ = local_2e0._16_4_ * fVar193;
    auVar31._20_4_ = local_2e0._20_4_ * fVar194;
    auVar31._24_4_ = local_2e0._24_4_ * fVar195;
    auVar31._28_4_ = fVar60 + 0.0;
    auVar126 = vfnmadd231ps_fma(auVar31,local_220,auVar81);
    local_740._0_4_ = auVar18._0_4_;
    local_740._4_4_ = auVar18._4_4_;
    uStack_738._0_4_ = auVar18._8_4_;
    uStack_738._4_4_ = auVar18._12_4_;
    uStack_730._0_4_ = auVar18._16_4_;
    uStack_730._4_4_ = auVar18._20_4_;
    uStack_728._0_4_ = auVar18._24_4_;
    uStack_728._4_4_ = auVar18._28_4_;
    auVar32._4_4_ = (float)local_740._4_4_ * fVar259;
    auVar32._0_4_ = (float)local_740._0_4_ * fVar258;
    auVar32._8_4_ = (float)uStack_738 * fVar191;
    auVar32._12_4_ = uStack_738._4_4_ * fVar192;
    auVar32._16_4_ = (float)uStack_730 * fVar193;
    auVar32._20_4_ = uStack_730._4_4_ * fVar194;
    auVar32._24_4_ = (float)uStack_728 * fVar195;
    auVar32._28_4_ = uStack_728._4_4_;
    auVar63 = vfnmadd231ps_fma(auVar32,auVar17,auVar81);
    auVar208._0_4_ = fVar85 * fVar258;
    auVar208._4_4_ = fVar159 * fVar259;
    auVar208._8_4_ = fVar59 * fVar191;
    auVar208._12_4_ = fVar226 * fVar192;
    auVar208._16_4_ = fVar193 * 0.0;
    auVar208._20_4_ = fVar194 * 0.0;
    auVar208._24_4_ = fVar195 * 0.0;
    auVar208._28_4_ = 0;
    auVar248 = vfnmadd231ps_fma(auVar208,auVar256,auVar81);
    uStack_284 = 0x40400000;
    auVar33._4_4_ = fStack_29c * fVar259;
    auVar33._0_4_ = local_2a0 * fVar258;
    auVar33._8_4_ = fStack_298 * fVar191;
    auVar33._12_4_ = fStack_294 * fVar192;
    auVar33._16_4_ = fStack_290 * fVar193;
    auVar33._20_4_ = fStack_28c * fVar194;
    auVar33._24_4_ = fStack_288 * fVar195;
    auVar33._28_4_ = auVar17._28_4_;
    auVar90 = vfnmadd231ps_fma(auVar33,local_260,auVar81);
    auVar34._4_4_ = local_280._4_4_ * fVar259;
    auVar34._0_4_ = local_280._0_4_ * fVar258;
    auVar34._8_4_ = local_280._8_4_ * fVar191;
    auVar34._12_4_ = local_280._12_4_ * fVar192;
    auVar34._16_4_ = local_280._16_4_ * fVar193;
    auVar34._20_4_ = local_280._20_4_ * fVar194;
    auVar34._24_4_ = local_280._24_4_ * fVar195;
    auVar34._28_4_ = local_280._28_4_;
    auVar240 = vfnmadd231ps_fma(auVar34,_local_5a0,auVar81);
    auVar35._4_4_ = local_4c0._4_4_ * fVar259;
    auVar35._0_4_ = local_4c0._0_4_ * fVar258;
    auVar35._8_4_ = local_4c0._8_4_ * fVar191;
    auVar35._12_4_ = local_4c0._12_4_ * fVar192;
    auVar35._16_4_ = local_4c0._16_4_ * fVar193;
    auVar35._20_4_ = local_4c0._20_4_ * fVar194;
    auVar35._24_4_ = local_4c0._24_4_ * fVar195;
    auVar35._28_4_ = auVar79._28_4_ + auVar80._28_4_;
    auVar89 = vfnmadd231ps_fma(auVar35,auVar19,auVar81);
    auVar16 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar79 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar80 = vminps_avx(ZEXT1632(auVar126),ZEXT1632(auVar63));
    auVar80 = vminps_avx(auVar16,auVar80);
    auVar16 = vmaxps_avx(ZEXT1632(auVar126),ZEXT1632(auVar63));
    auVar79 = vmaxps_avx(auVar79,auVar16);
    auVar15 = vminps_avx(ZEXT1632(auVar248),ZEXT1632(auVar90));
    auVar16 = vmaxps_avx(ZEXT1632(auVar248),ZEXT1632(auVar90));
    auVar11 = vminps_avx(ZEXT1632(auVar240),ZEXT1632(auVar89));
    auVar15 = vminps_avx(auVar15,auVar11);
    auVar15 = vminps_avx(auVar80,auVar15);
    auVar80 = vmaxps_avx(ZEXT1632(auVar240),ZEXT1632(auVar89));
    auVar16 = vmaxps_avx(auVar16,auVar80);
    auVar16 = vmaxps_avx(auVar79,auVar16);
    auVar46._4_4_ = fStack_1bc;
    auVar46._0_4_ = local_1c0;
    auVar46._8_4_ = fStack_1b8;
    auVar46._12_4_ = fStack_1b4;
    auVar46._16_4_ = fStack_1b0;
    auVar46._20_4_ = fStack_1ac;
    auVar46._24_4_ = fStack_1a8;
    auVar46._28_4_ = fStack_1a4;
    auVar79 = vcmpps_avx(auVar15,auVar46,2);
    auVar45._4_4_ = fStack_1dc;
    auVar45._0_4_ = local_1e0;
    auVar45._8_4_ = fStack_1d8;
    auVar45._12_4_ = fStack_1d4;
    auVar45._16_4_ = fStack_1d0;
    auVar45._20_4_ = fStack_1cc;
    auVar45._24_4_ = fStack_1c8;
    auVar45._28_4_ = fStack_1c4;
    auVar16 = vcmpps_avx(auVar16,auVar45,5);
    auVar79 = vandps_avx(auVar16,auVar79);
    auVar16 = local_300 & auVar79;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar16 = vsubps_avx(auVar17,local_200);
      auVar80 = vsubps_avx(auVar19,auVar256);
      fVar258 = auVar16._0_4_ + auVar80._0_4_;
      fVar259 = auVar16._4_4_ + auVar80._4_4_;
      fVar191 = auVar16._8_4_ + auVar80._8_4_;
      fVar192 = auVar16._12_4_ + auVar80._12_4_;
      fVar193 = auVar16._16_4_ + auVar80._16_4_;
      fVar194 = auVar16._20_4_ + auVar80._20_4_;
      fVar195 = auVar16._24_4_ + auVar80._24_4_;
      auVar15 = vsubps_avx(auVar18,local_240);
      auVar11 = vsubps_avx(_local_4c0,ZEXT1632(auVar61));
      auVar107._0_4_ = auVar15._0_4_ + auVar11._0_4_;
      auVar107._4_4_ = auVar15._4_4_ + auVar11._4_4_;
      auVar107._8_4_ = auVar15._8_4_ + auVar11._8_4_;
      auVar107._12_4_ = auVar15._12_4_ + auVar11._12_4_;
      auVar107._16_4_ = auVar15._16_4_ + auVar11._16_4_;
      auVar107._20_4_ = auVar15._20_4_ + auVar11._20_4_;
      auVar107._24_4_ = auVar15._24_4_ + auVar11._24_4_;
      fVar60 = auVar11._28_4_;
      auVar107._28_4_ = auVar15._28_4_ + fVar60;
      auVar36._4_4_ = fVar86 * fVar259;
      auVar36._0_4_ = fVar84 * fVar258;
      auVar36._8_4_ = fVar87 * fVar191;
      auVar36._12_4_ = fVar118 * fVar192;
      auVar36._16_4_ = fVar193 * 0.0;
      auVar36._20_4_ = fVar194 * 0.0;
      auVar36._24_4_ = fVar195 * 0.0;
      auVar36._28_4_ = auVar19._28_4_;
      auVar248 = vfnmadd231ps_fma(auVar36,auVar107,local_200);
      auVar37._4_4_ = fVar259 * fStack_2bc;
      auVar37._0_4_ = fVar258 * local_2c0;
      auVar37._8_4_ = fVar191 * fStack_2b8;
      auVar37._12_4_ = fVar192 * fStack_2b4;
      auVar37._16_4_ = fVar193 * fStack_2b0;
      auVar37._20_4_ = fVar194 * fStack_2ac;
      auVar37._24_4_ = fVar195 * fStack_2a8;
      auVar37._28_4_ = 0;
      auVar9 = vfnmadd213ps_fma(auVar106,auVar107,auVar37);
      auVar38._4_4_ = fVar259 * local_2e0._4_4_;
      auVar38._0_4_ = fVar258 * local_2e0._0_4_;
      auVar38._8_4_ = fVar191 * local_2e0._8_4_;
      auVar38._12_4_ = fVar192 * local_2e0._12_4_;
      auVar38._16_4_ = fVar193 * local_2e0._16_4_;
      auVar38._20_4_ = fVar194 * local_2e0._20_4_;
      auVar38._24_4_ = fVar195 * local_2e0._24_4_;
      auVar38._28_4_ = 0;
      auVar10 = vfnmadd213ps_fma(local_220,auVar107,auVar38);
      auVar39._4_4_ = (float)local_740._4_4_ * fVar259;
      auVar39._0_4_ = (float)local_740._0_4_ * fVar258;
      auVar39._8_4_ = (float)uStack_738 * fVar191;
      auVar39._12_4_ = uStack_738._4_4_ * fVar192;
      auVar39._16_4_ = (float)uStack_730 * fVar193;
      auVar39._20_4_ = uStack_730._4_4_ * fVar194;
      auVar39._24_4_ = (float)uStack_728 * fVar195;
      auVar39._28_4_ = 0;
      auVar61 = vfnmadd231ps_fma(auVar39,auVar107,auVar17);
      auVar131._0_4_ = fVar85 * fVar258;
      auVar131._4_4_ = fVar159 * fVar259;
      auVar131._8_4_ = fVar59 * fVar191;
      auVar131._12_4_ = fVar226 * fVar192;
      auVar131._16_4_ = fVar193 * 0.0;
      auVar131._20_4_ = fVar194 * 0.0;
      auVar131._24_4_ = fVar195 * 0.0;
      auVar131._28_4_ = 0;
      auVar90 = vfnmadd231ps_fma(auVar131,auVar107,auVar256);
      auVar40._4_4_ = fVar259 * fStack_29c;
      auVar40._0_4_ = fVar258 * local_2a0;
      auVar40._8_4_ = fVar191 * fStack_298;
      auVar40._12_4_ = fVar192 * fStack_294;
      auVar40._16_4_ = fVar193 * fStack_290;
      auVar40._20_4_ = fVar194 * fStack_28c;
      auVar40._24_4_ = fVar195 * fStack_288;
      auVar40._28_4_ = fVar60;
      auVar126 = vfnmadd213ps_fma(local_260,auVar107,auVar40);
      auVar41._4_4_ = fVar259 * local_280._4_4_;
      auVar41._0_4_ = fVar258 * local_280._0_4_;
      auVar41._8_4_ = fVar191 * local_280._8_4_;
      auVar41._12_4_ = fVar192 * local_280._12_4_;
      auVar41._16_4_ = fVar193 * local_280._16_4_;
      auVar41._20_4_ = fVar194 * local_280._20_4_;
      auVar41._24_4_ = fVar195 * local_280._24_4_;
      auVar41._28_4_ = fVar60;
      auVar63 = vfnmadd213ps_fma(_local_5a0,auVar107,auVar41);
      auVar224 = ZEXT1664(auVar63);
      auVar42._4_4_ = fVar259 * local_4c0._4_4_;
      auVar42._0_4_ = fVar258 * local_4c0._0_4_;
      auVar42._8_4_ = fVar191 * local_4c0._8_4_;
      auVar42._12_4_ = fVar192 * local_4c0._12_4_;
      auVar42._16_4_ = fVar193 * local_4c0._16_4_;
      auVar42._20_4_ = fVar194 * local_4c0._20_4_;
      auVar42._24_4_ = fVar195 * local_4c0._24_4_;
      auVar42._28_4_ = auVar16._28_4_ + auVar80._28_4_;
      auVar240 = vfnmadd231ps_fma(auVar42,auVar107,auVar19);
      auVar80 = vminps_avx(ZEXT1632(auVar248),ZEXT1632(auVar9));
      auVar16 = vmaxps_avx(ZEXT1632(auVar248),ZEXT1632(auVar9));
      auVar15 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar61));
      auVar15 = vminps_avx(auVar80,auVar15);
      auVar80 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar61));
      auVar16 = vmaxps_avx(auVar16,auVar80);
      auVar11 = vminps_avx(ZEXT1632(auVar90),ZEXT1632(auVar126));
      auVar80 = vmaxps_avx(ZEXT1632(auVar90),ZEXT1632(auVar126));
      auVar17 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar240));
      auVar11 = vminps_avx(auVar11,auVar17);
      auVar11 = vminps_avx(auVar15,auVar11);
      auVar15 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar240));
      auVar80 = vmaxps_avx(auVar80,auVar15);
      auVar80 = vmaxps_avx(auVar16,auVar80);
      auVar16 = vcmpps_avx(auVar11,auVar46,2);
      auVar80 = vcmpps_avx(auVar80,auVar45,5);
      auVar16 = vandps_avx(auVar80,auVar16);
      auVar79 = vandps_avx(auVar79,local_300);
      auVar80 = auVar79 & auVar16;
      if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar80 >> 0x7f,0) != '\0') ||
            (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar80 >> 0xbf,0) != '\0') ||
          (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar80[0x1f] < '\0') {
        auVar79 = vandps_avx(auVar16,auVar79);
        uVar53 = vmovmskps_avx(auVar79);
        if (uVar53 != 0) {
          uVar54 = (ulong)uVar56;
          auStack_4d0[uVar54] = uVar53 & 0xff;
          uVar88 = vmovlps_avx(local_430);
          *(undefined8 *)(&uStack_380 + uVar54 * 2) = uVar88;
          uVar49 = vmovlps_avx(auVar66);
          auStack_1a0[uVar54] = uVar49;
          uVar56 = uVar56 + 1;
        }
      }
    }
    if (uVar56 != 0) {
      do {
        uVar54 = (ulong)(uVar56 - 1);
        uVar52 = auStack_4d0[uVar54];
        uVar53 = (&uStack_380)[uVar54 * 2];
        fVar84 = afStack_37c[uVar54 * 2];
        iVar48 = 0;
        for (uVar49 = (ulong)uVar52; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
          iVar48 = iVar48 + 1;
        }
        uVar52 = uVar52 - 1 & uVar52;
        if (uVar52 == 0) {
          uVar56 = uVar56 - 1;
        }
        auVar66._8_8_ = 0;
        auVar66._0_8_ = auStack_1a0[uVar54];
        auStack_4d0[uVar54] = uVar52;
        fVar86 = (float)(iVar48 + 1) * 0.14285715;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * (float)iVar48 * 0.14285715)),
                                 ZEXT416(uVar53),ZEXT416((uint)(1.0 - (float)iVar48 * 0.14285715)));
        auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * fVar86)),ZEXT416(uVar53),
                                  ZEXT416((uint)(1.0 - fVar86)));
        fVar86 = auVar10._0_4_;
        fVar87 = auVar9._0_4_;
        fVar84 = fVar86 - fVar87;
        if (0.16666667 <= fVar84) {
          local_430 = vinsertps_avx(auVar9,auVar10,0x10);
          goto LAB_016297f9;
        }
        auVar126 = vshufps_avx(auVar66,auVar66,0x50);
        auVar95._8_4_ = 0x3f800000;
        auVar95._0_8_ = 0x3f8000003f800000;
        auVar95._12_4_ = 0x3f800000;
        auVar63 = vsubps_avx(auVar95,auVar126);
        fVar118 = auVar126._0_4_;
        auVar138._0_4_ = fVar118 * fVar133;
        fVar85 = auVar126._4_4_;
        auVar138._4_4_ = fVar85 * fVar143;
        fVar60 = auVar126._8_4_;
        auVar138._8_4_ = fVar60 * fVar133;
        fVar159 = auVar126._12_4_;
        auVar138._12_4_ = fVar159 * fVar143;
        auVar149._0_4_ = fVar118 * fVar244;
        auVar149._4_4_ = fVar85 * fVar257;
        auVar149._8_4_ = fVar60 * fVar244;
        auVar149._12_4_ = fVar159 * fVar257;
        auVar172._0_4_ = fVar118 * fVar196;
        auVar172._4_4_ = fVar85 * fVar209;
        auVar172._8_4_ = fVar60 * fVar196;
        auVar172._12_4_ = fVar159 * fVar209;
        auVar68._0_4_ = fVar118 * fVar210;
        auVar68._4_4_ = fVar85 * fVar225;
        auVar68._8_4_ = fVar60 * fVar210;
        auVar68._12_4_ = fVar159 * fVar225;
        auVar126 = vfmadd231ps_fma(auVar138,auVar63,auVar183);
        auVar248 = vfmadd231ps_fma(auVar149,auVar63,auVar229);
        auVar61 = vfmadd231ps_fma(auVar172,auVar63,auVar247);
        auVar63 = vfmadd231ps_fma(auVar68,auVar63,auVar262);
        auVar132._16_16_ = auVar126;
        auVar132._0_16_ = auVar126;
        auVar142._16_16_ = auVar248;
        auVar142._0_16_ = auVar248;
        auVar157._16_16_ = auVar61;
        auVar157._0_16_ = auVar61;
        auVar190._4_4_ = fVar87;
        auVar190._0_4_ = fVar87;
        auVar190._8_4_ = fVar87;
        auVar190._12_4_ = fVar87;
        auVar190._20_4_ = fVar86;
        auVar190._16_4_ = fVar86;
        auVar190._24_4_ = fVar86;
        auVar190._28_4_ = fVar86;
        auVar79 = vsubps_avx(auVar142,auVar132);
        auVar248 = vfmadd213ps_fma(auVar79,auVar190,auVar132);
        auVar79 = vsubps_avx(auVar157,auVar142);
        auVar90 = vfmadd213ps_fma(auVar79,auVar190,auVar142);
        auVar126 = vsubps_avx(auVar63,auVar61);
        auVar82._16_16_ = auVar126;
        auVar82._0_16_ = auVar126;
        auVar126 = vfmadd213ps_fma(auVar82,auVar190,auVar157);
        auVar79 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar248));
        auVar63 = vfmadd213ps_fma(auVar79,auVar190,ZEXT1632(auVar248));
        auVar79 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar90));
        auVar126 = vfmadd213ps_fma(auVar79,auVar190,ZEXT1632(auVar90));
        auVar79 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar63));
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar63),auVar79,auVar190);
        fVar226 = auVar79._4_4_ * 3.0;
        fVar118 = fVar84 * 0.33333334;
        auVar184._0_8_ =
             CONCAT44(auVar89._4_4_ + fVar118 * fVar226,
                      auVar89._0_4_ + fVar118 * auVar79._0_4_ * 3.0);
        auVar184._8_4_ = auVar89._8_4_ + fVar118 * auVar79._8_4_ * 3.0;
        auVar184._12_4_ = auVar89._12_4_ + fVar118 * auVar79._12_4_ * 3.0;
        _local_4c0 = vshufpd_avx(auVar89,auVar89,3);
        auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar126 = vsubps_avx(_local_4c0,auVar89);
        auVar248 = vsubps_avx(auVar63,(undefined1  [16])0x0);
        auVar69._0_4_ = auVar126._0_4_ + auVar248._0_4_;
        auVar69._4_4_ = auVar126._4_4_ + auVar248._4_4_;
        auVar69._8_4_ = auVar126._8_4_ + auVar248._8_4_;
        auVar69._12_4_ = auVar126._12_4_ + auVar248._12_4_;
        auVar126 = vshufps_avx(auVar89,auVar89,0xb1);
        auVar248 = vshufps_avx(auVar184,auVar184,0xb1);
        auVar272._4_4_ = auVar69._0_4_;
        auVar272._0_4_ = auVar69._0_4_;
        auVar272._8_4_ = auVar69._0_4_;
        auVar272._12_4_ = auVar69._0_4_;
        auVar61 = vshufps_avx(auVar69,auVar69,0x55);
        fVar85 = auVar61._0_4_;
        auVar70._0_4_ = fVar85 * auVar126._0_4_;
        fVar60 = auVar61._4_4_;
        auVar70._4_4_ = fVar60 * auVar126._4_4_;
        fVar159 = auVar61._8_4_;
        auVar70._8_4_ = fVar159 * auVar126._8_4_;
        fVar59 = auVar61._12_4_;
        auVar70._12_4_ = fVar59 * auVar126._12_4_;
        auVar150._0_4_ = fVar85 * auVar248._0_4_;
        auVar150._4_4_ = fVar60 * auVar248._4_4_;
        auVar150._8_4_ = fVar159 * auVar248._8_4_;
        auVar150._12_4_ = fVar59 * auVar248._12_4_;
        auVar90 = vfmadd231ps_fma(auVar70,auVar272,auVar89);
        _local_5a0 = auVar184;
        auVar240 = vfmadd231ps_fma(auVar150,auVar272,auVar184);
        auVar248 = vshufps_avx(auVar90,auVar90,0xe8);
        auVar61 = vshufps_avx(auVar240,auVar240,0xe8);
        auVar126 = vcmpps_avx(auVar248,auVar61,1);
        uVar53 = vextractps_avx(auVar126,0);
        auVar134 = auVar240;
        if ((uVar53 & 1) == 0) {
          auVar134 = auVar90;
        }
        auVar122._0_4_ = fVar118 * auVar79._16_4_ * 3.0;
        auVar122._4_4_ = fVar118 * fVar226;
        auVar122._8_4_ = fVar118 * auVar79._24_4_ * 3.0;
        auVar122._12_4_ = fVar118 * auVar224._28_4_;
        auVar180 = vsubps_avx((undefined1  [16])0x0,auVar122);
        auVar123 = vshufps_avx(auVar180,auVar180,0xb1);
        auVar144 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar185._0_4_ = fVar85 * auVar123._0_4_;
        auVar185._4_4_ = fVar60 * auVar123._4_4_;
        auVar185._8_4_ = fVar159 * auVar123._8_4_;
        auVar185._12_4_ = fVar59 * auVar123._12_4_;
        auVar202._0_4_ = auVar144._0_4_ * fVar85;
        auVar202._4_4_ = auVar144._4_4_ * fVar60;
        auVar202._8_4_ = auVar144._8_4_ * fVar159;
        auVar202._12_4_ = auVar144._12_4_ * fVar59;
        auVar197 = vfmadd231ps_fma(auVar185,auVar272,auVar180);
        auVar198 = vfmadd231ps_fma(auVar202,(undefined1  [16])0x0,auVar272);
        auVar144 = vshufps_avx(auVar197,auVar197,0xe8);
        auVar145 = vshufps_avx(auVar198,auVar198,0xe8);
        auVar224 = ZEXT1664(auVar145);
        auVar123 = vcmpps_avx(auVar144,auVar145,1);
        uVar53 = vextractps_avx(auVar123,0);
        auVar211 = auVar198;
        if ((uVar53 & 1) == 0) {
          auVar211 = auVar197;
        }
        auVar134 = vmaxss_avx(auVar211,auVar134);
        auVar248 = vminps_avx(auVar248,auVar61);
        auVar61 = vminps_avx(auVar144,auVar145);
        auVar61 = vminps_avx(auVar248,auVar61);
        auVar126 = vshufps_avx(auVar126,auVar126,0x55);
        auVar126 = vblendps_avx(auVar126,auVar123,2);
        auVar123 = vpslld_avx(auVar126,0x1f);
        auVar126 = vshufpd_avx(auVar240,auVar240,1);
        auVar126 = vinsertps_avx(auVar126,auVar198,0x9c);
        auVar248 = vshufpd_avx(auVar90,auVar90,1);
        auVar248 = vinsertps_avx(auVar248,auVar197,0x9c);
        auVar126 = vblendvps_avx(auVar248,auVar126,auVar123);
        auVar248 = vmovshdup_avx(auVar126);
        auVar126 = vmaxss_avx(auVar248,auVar126);
        fVar159 = auVar61._0_4_;
        auVar248 = vmovshdup_avx(auVar61);
        fVar60 = auVar126._0_4_;
        fVar118 = auVar248._0_4_;
        fVar85 = auVar134._0_4_;
        if (((fVar159 < 0.0001) && (-0.0001 < fVar60)) || (fVar118 < 0.0001 && -0.0001 < fVar60)) {
LAB_0162a0ab:
          auVar90 = vcmpps_avx(auVar61,_DAT_01f7aa10,1);
          auVar240 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar248 = vcmpss_avx(auVar134,ZEXT816(0) << 0x20,1);
          auVar96._8_4_ = 0x3f800000;
          auVar96._0_8_ = 0x3f8000003f800000;
          auVar96._12_4_ = 0x3f800000;
          auVar112._8_4_ = 0xbf800000;
          auVar112._0_8_ = 0xbf800000bf800000;
          auVar112._12_4_ = 0xbf800000;
          auVar248 = vblendvps_avx(auVar96,auVar112,auVar248);
          auVar90 = vblendvps_avx(auVar96,auVar112,auVar90);
          fVar226 = auVar90._0_4_;
          fVar59 = auVar248._0_4_;
          auVar248 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar226 == fVar59) && (!NAN(fVar226) && !NAN(fVar59))) {
            auVar248 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar226 == fVar59) && (!NAN(fVar226) && !NAN(fVar59))) {
            auVar240 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar90 = vmovshdup_avx(auVar90);
          fVar258 = auVar90._0_4_;
          if ((fVar226 != fVar258) || (NAN(fVar226) || NAN(fVar258))) {
            if ((fVar118 != fVar159) || (NAN(fVar118) || NAN(fVar159))) {
              auVar124._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
              auVar124._8_4_ = auVar61._8_4_ ^ 0x80000000;
              auVar124._12_4_ = auVar61._12_4_ ^ 0x80000000;
              auVar125._0_4_ = -fVar159 / (fVar118 - fVar159);
              auVar125._4_12_ = auVar124._4_12_;
              auVar61 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar125._0_4_)),auVar125,ZEXT416(0));
              auVar90 = auVar61;
            }
            else {
              auVar61 = ZEXT816(0) << 0x20;
              if ((fVar159 != 0.0) || (auVar90 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar159))) {
                auVar61 = SUB6416(ZEXT464(0x7f800000),0);
                auVar90 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar248 = vminss_avx(auVar248,auVar61);
            auVar240 = vmaxss_avx(auVar90,auVar240);
          }
          auVar126 = vcmpss_avx(auVar126,ZEXT416(0),1);
          auVar97._8_4_ = 0x3f800000;
          auVar97._0_8_ = 0x3f8000003f800000;
          auVar97._12_4_ = 0x3f800000;
          auVar113._8_4_ = 0xbf800000;
          auVar113._0_8_ = 0xbf800000bf800000;
          auVar113._12_4_ = 0xbf800000;
          auVar126 = vblendvps_avx(auVar97,auVar113,auVar126);
          fVar118 = auVar126._0_4_;
          if ((fVar59 != fVar118) || (NAN(fVar59) || NAN(fVar118))) {
            if ((fVar60 != fVar85) || (NAN(fVar60) || NAN(fVar85))) {
              auVar71._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
              auVar71._8_4_ = auVar134._8_4_ ^ 0x80000000;
              auVar71._12_4_ = auVar134._12_4_ ^ 0x80000000;
              auVar127._0_4_ = -fVar85 / (fVar60 - fVar85);
              auVar127._4_12_ = auVar71._4_12_;
              auVar126 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar127,ZEXT416(0));
              auVar61 = auVar126;
            }
            else {
              auVar126 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar85 != 0.0) || (auVar61 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
                auVar126 = SUB6416(ZEXT464(0xff800000),0);
                auVar61 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar248 = vminss_avx(auVar248,auVar61);
            auVar240 = vmaxss_avx(auVar126,auVar240);
          }
          if ((fVar258 != fVar118) || (NAN(fVar258) || NAN(fVar118))) {
            auVar248 = vminss_avx(auVar248,SUB6416(ZEXT464(0x3f800000),0));
            auVar240 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar240);
          }
          auVar126 = vmaxss_avx(ZEXT816(0) << 0x40,auVar248);
          auVar248 = vminss_avx(auVar240,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar126._0_4_ <= auVar248._0_4_) {
            auVar126 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar126._0_4_ + -0.1)));
            auVar248 = vminss_avx(ZEXT416((uint)(auVar248._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar139._0_8_ = auVar89._0_8_;
            auVar139._8_8_ = auVar139._0_8_;
            auVar216._8_8_ = auVar184._0_8_;
            auVar216._0_8_ = auVar184._0_8_;
            auVar230._8_8_ = auVar180._0_8_;
            auVar230._0_8_ = auVar180._0_8_;
            auVar61 = vshufpd_avx(auVar184,auVar184,3);
            auVar90 = vshufpd_avx(auVar180,auVar180,3);
            auVar240 = vshufps_avx(auVar126,auVar248,0);
            auVar72._8_4_ = 0x3f800000;
            auVar72._0_8_ = 0x3f8000003f800000;
            auVar72._12_4_ = 0x3f800000;
            auVar89 = vsubps_avx(auVar72,auVar240);
            fVar118 = auVar240._0_4_;
            auVar73._0_4_ = fVar118 * (float)local_4c0._0_4_;
            fVar85 = auVar240._4_4_;
            auVar73._4_4_ = fVar85 * (float)local_4c0._4_4_;
            fVar60 = auVar240._8_4_;
            auVar73._8_4_ = fVar60 * fStack_4b8;
            fVar159 = auVar240._12_4_;
            auVar73._12_4_ = fVar159 * fStack_4b4;
            auVar173._0_4_ = fVar118 * auVar61._0_4_;
            auVar173._4_4_ = fVar85 * auVar61._4_4_;
            auVar173._8_4_ = fVar60 * auVar61._8_4_;
            auVar173._12_4_ = fVar159 * auVar61._12_4_;
            auVar186._0_4_ = fVar118 * auVar90._0_4_;
            auVar186._4_4_ = fVar85 * auVar90._4_4_;
            auVar186._8_4_ = fVar60 * auVar90._8_4_;
            auVar186._12_4_ = fVar159 * auVar90._12_4_;
            local_620 = auVar63._0_4_;
            fStack_61c = auVar63._4_4_;
            fStack_618 = auVar63._8_4_;
            fStack_614 = auVar63._12_4_;
            auVar203._0_4_ = fVar118 * local_620;
            auVar203._4_4_ = fVar85 * fStack_61c;
            auVar203._8_4_ = fVar60 * fStack_618;
            auVar203._12_4_ = fVar159 * fStack_614;
            auVar90 = vfmadd231ps_fma(auVar73,auVar89,auVar139);
            auVar240 = vfmadd231ps_fma(auVar173,auVar89,auVar216);
            auVar134 = vfmadd231ps_fma(auVar186,auVar89,auVar230);
            auVar89 = vfmadd231ps_fma(auVar203,auVar89,ZEXT816(0));
            auVar63 = vmovshdup_avx(auVar66);
            auVar197 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * auVar126._0_4_)),auVar66,
                                       ZEXT416((uint)(1.0 - auVar126._0_4_)));
            auVar198 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * auVar248._0_4_)),auVar66,
                                       ZEXT416((uint)(1.0 - auVar248._0_4_)));
            fVar118 = 1.0 / fVar84;
            auVar126 = vsubps_avx(auVar240,auVar90);
            auVar217._0_4_ = auVar126._0_4_ * 3.0;
            auVar217._4_4_ = auVar126._4_4_ * 3.0;
            auVar217._8_4_ = auVar126._8_4_ * 3.0;
            auVar217._12_4_ = auVar126._12_4_ * 3.0;
            auVar126 = vsubps_avx(auVar134,auVar240);
            auVar231._0_4_ = auVar126._0_4_ * 3.0;
            auVar231._4_4_ = auVar126._4_4_ * 3.0;
            auVar231._8_4_ = auVar126._8_4_ * 3.0;
            auVar231._12_4_ = auVar126._12_4_ * 3.0;
            auVar126 = vsubps_avx(auVar89,auVar134);
            auVar241._0_4_ = auVar126._0_4_ * 3.0;
            auVar241._4_4_ = auVar126._4_4_ * 3.0;
            auVar241._8_4_ = auVar126._8_4_ * 3.0;
            auVar241._12_4_ = auVar126._12_4_ * 3.0;
            auVar63 = vminps_avx(auVar231,auVar241);
            auVar126 = vmaxps_avx(auVar231,auVar241);
            auVar63 = vminps_avx(auVar217,auVar63);
            auVar126 = vmaxps_avx(auVar217,auVar126);
            auVar248 = vshufpd_avx(auVar63,auVar63,3);
            auVar61 = vshufpd_avx(auVar126,auVar126,3);
            auVar63 = vminps_avx(auVar63,auVar248);
            auVar126 = vmaxps_avx(auVar126,auVar61);
            auVar232._0_4_ = auVar63._0_4_ * fVar118;
            auVar232._4_4_ = auVar63._4_4_ * fVar118;
            auVar232._8_4_ = auVar63._8_4_ * fVar118;
            auVar232._12_4_ = auVar63._12_4_ * fVar118;
            auVar218._0_4_ = auVar126._0_4_ * fVar118;
            auVar218._4_4_ = auVar126._4_4_ * fVar118;
            auVar218._8_4_ = auVar126._8_4_ * fVar118;
            auVar218._12_4_ = auVar126._12_4_ * fVar118;
            fVar118 = 1.0 / (auVar198._0_4_ - auVar197._0_4_);
            auVar126 = vshufpd_avx(auVar90,auVar90,3);
            auVar63 = vshufpd_avx(auVar240,auVar240,3);
            auVar248 = vshufpd_avx(auVar134,auVar134,3);
            auVar61 = vshufpd_avx(auVar89,auVar89,3);
            auVar126 = vsubps_avx(auVar126,auVar90);
            auVar90 = vsubps_avx(auVar63,auVar240);
            auVar240 = vsubps_avx(auVar248,auVar134);
            auVar61 = vsubps_avx(auVar61,auVar89);
            auVar63 = vminps_avx(auVar126,auVar90);
            auVar126 = vmaxps_avx(auVar126,auVar90);
            auVar248 = vminps_avx(auVar240,auVar61);
            auVar248 = vminps_avx(auVar63,auVar248);
            auVar63 = vmaxps_avx(auVar240,auVar61);
            auVar126 = vmaxps_avx(auVar126,auVar63);
            auVar263._0_4_ = fVar118 * auVar248._0_4_;
            auVar263._4_4_ = fVar118 * auVar248._4_4_;
            auVar263._8_4_ = fVar118 * auVar248._8_4_;
            auVar263._12_4_ = fVar118 * auVar248._12_4_;
            auVar249._0_4_ = fVar118 * auVar126._0_4_;
            auVar249._4_4_ = fVar118 * auVar126._4_4_;
            auVar249._8_4_ = fVar118 * auVar126._8_4_;
            auVar249._12_4_ = fVar118 * auVar126._12_4_;
            auVar61 = vinsertps_avx(auVar9,auVar197,0x10);
            auVar90 = vinsertps_avx(auVar10,auVar198,0x10);
            auVar242._0_4_ = (auVar61._0_4_ + auVar90._0_4_) * 0.5;
            auVar242._4_4_ = (auVar61._4_4_ + auVar90._4_4_) * 0.5;
            auVar242._8_4_ = (auVar61._8_4_ + auVar90._8_4_) * 0.5;
            auVar242._12_4_ = (auVar61._12_4_ + auVar90._12_4_) * 0.5;
            auVar74._4_4_ = auVar242._0_4_;
            auVar74._0_4_ = auVar242._0_4_;
            auVar74._8_4_ = auVar242._0_4_;
            auVar74._12_4_ = auVar242._0_4_;
            auVar126 = vfmadd213ps_fma(local_3a0,auVar74,local_4e0);
            auVar63 = vfmadd213ps_fma(local_3b0,auVar74,auVar12);
            auVar248 = vfmadd213ps_fma(local_3c0,auVar74,auVar13);
            auVar10 = vsubps_avx(auVar63,auVar126);
            auVar126 = vfmadd213ps_fma(auVar10,auVar74,auVar126);
            auVar10 = vsubps_avx(auVar248,auVar63);
            auVar10 = vfmadd213ps_fma(auVar10,auVar74,auVar63);
            auVar10 = vsubps_avx(auVar10,auVar126);
            auVar126 = vfmadd231ps_fma(auVar126,auVar10,auVar74);
            auVar75._0_8_ = CONCAT44(auVar10._4_4_ * 3.0,auVar10._0_4_ * 3.0);
            auVar75._8_4_ = auVar10._8_4_ * 3.0;
            auVar75._12_4_ = auVar10._12_4_ * 3.0;
            auVar273._8_8_ = auVar126._0_8_;
            auVar273._0_8_ = auVar126._0_8_;
            auVar10 = vshufpd_avx(auVar126,auVar126,3);
            auVar126 = vshufps_avx(auVar242,auVar242,0x55);
            auVar89 = vsubps_avx(auVar10,auVar273);
            auVar123 = vfmadd231ps_fma(auVar273,auVar126,auVar89);
            auVar280._8_8_ = auVar75._0_8_;
            auVar280._0_8_ = auVar75._0_8_;
            auVar10 = vshufpd_avx(auVar75,auVar75,3);
            auVar10 = vsubps_avx(auVar10,auVar280);
            auVar134 = vfmadd213ps_fma(auVar10,auVar126,auVar280);
            auVar126 = vmovshdup_avx(auVar134);
            auVar281._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
            auVar281._8_4_ = auVar126._8_4_ ^ 0x80000000;
            auVar281._12_4_ = auVar126._12_4_ ^ 0x80000000;
            auVar63 = vmovshdup_avx(auVar89);
            auVar10 = vunpcklps_avx(auVar63,auVar281);
            auVar248 = vshufps_avx(auVar10,auVar281,4);
            auVar240 = vshufps_avx(auVar242,auVar242,0x54);
            auVar128._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
            auVar128._8_4_ = auVar89._8_4_ ^ 0x80000000;
            auVar128._12_4_ = auVar89._12_4_ ^ 0x80000000;
            auVar10 = vmovlhps_avx(auVar128,auVar134);
            auVar10 = vshufps_avx(auVar10,auVar134,8);
            auVar126 = vfmsub231ss_fma(ZEXT416((uint)(auVar89._0_4_ * auVar126._0_4_)),auVar63,
                                       auVar134);
            uVar58 = auVar126._0_4_;
            auVar76._4_4_ = uVar58;
            auVar76._0_4_ = uVar58;
            auVar76._8_4_ = uVar58;
            auVar76._12_4_ = uVar58;
            auVar126 = vdivps_avx(auVar248,auVar76);
            auVar63 = vdivps_avx(auVar10,auVar76);
            fVar60 = auVar123._0_4_;
            fVar118 = auVar126._0_4_;
            auVar10 = vshufps_avx(auVar123,auVar123,0x55);
            fVar85 = auVar63._0_4_;
            auVar77._0_4_ = fVar60 * fVar118 + auVar10._0_4_ * fVar85;
            auVar77._4_4_ = fVar60 * auVar126._4_4_ + auVar10._4_4_ * auVar63._4_4_;
            auVar77._8_4_ = fVar60 * auVar126._8_4_ + auVar10._8_4_ * auVar63._8_4_;
            auVar77._12_4_ = fVar60 * auVar126._12_4_ + auVar10._12_4_ * auVar63._12_4_;
            auVar180 = vsubps_avx(auVar240,auVar77);
            auVar240 = vmovshdup_avx(auVar126);
            auVar10 = vinsertps_avx(auVar232,auVar263,0x1c);
            auVar151._0_4_ = auVar240._0_4_ * auVar10._0_4_;
            auVar151._4_4_ = auVar240._4_4_ * auVar10._4_4_;
            auVar151._8_4_ = auVar240._8_4_ * auVar10._8_4_;
            auVar151._12_4_ = auVar240._12_4_ * auVar10._12_4_;
            auVar248 = vinsertps_avx(auVar218,auVar249,0x1c);
            auVar98._0_4_ = auVar248._0_4_ * auVar240._0_4_;
            auVar98._4_4_ = auVar248._4_4_ * auVar240._4_4_;
            auVar98._8_4_ = auVar248._8_4_ * auVar240._8_4_;
            auVar98._12_4_ = auVar248._12_4_ * auVar240._12_4_;
            auVar123 = vminps_avx(auVar151,auVar98);
            auVar134 = vmaxps_avx(auVar98,auVar151);
            auVar240 = vinsertps_avx(auVar263,auVar232,0x4c);
            auVar144 = vmovshdup_avx(auVar63);
            auVar89 = vinsertps_avx(auVar249,auVar218,0x4c);
            auVar250._0_4_ = auVar144._0_4_ * auVar240._0_4_;
            auVar250._4_4_ = auVar144._4_4_ * auVar240._4_4_;
            auVar250._8_4_ = auVar144._8_4_ * auVar240._8_4_;
            auVar250._12_4_ = auVar144._12_4_ * auVar240._12_4_;
            auVar233._0_4_ = auVar144._0_4_ * auVar89._0_4_;
            auVar233._4_4_ = auVar144._4_4_ * auVar89._4_4_;
            auVar233._8_4_ = auVar144._8_4_ * auVar89._8_4_;
            auVar233._12_4_ = auVar144._12_4_ * auVar89._12_4_;
            auVar144 = vminps_avx(auVar250,auVar233);
            auVar264._0_4_ = auVar123._0_4_ + auVar144._0_4_;
            auVar264._4_4_ = auVar123._4_4_ + auVar144._4_4_;
            auVar264._8_4_ = auVar123._8_4_ + auVar144._8_4_;
            auVar264._12_4_ = auVar123._12_4_ + auVar144._12_4_;
            auVar123 = vmaxps_avx(auVar233,auVar250);
            auVar99._0_4_ = auVar123._0_4_ + auVar134._0_4_;
            auVar99._4_4_ = auVar123._4_4_ + auVar134._4_4_;
            auVar99._8_4_ = auVar123._8_4_ + auVar134._8_4_;
            auVar99._12_4_ = auVar123._12_4_ + auVar134._12_4_;
            auVar234._8_8_ = 0x3f80000000000000;
            auVar234._0_8_ = 0x3f80000000000000;
            auVar134 = vsubps_avx(auVar234,auVar99);
            auVar123 = vsubps_avx(auVar234,auVar264);
            auVar144 = vsubps_avx(auVar61,auVar242);
            auVar145 = vsubps_avx(auVar90,auVar242);
            auVar114._0_4_ = fVar118 * auVar10._0_4_;
            auVar114._4_4_ = fVar118 * auVar10._4_4_;
            auVar114._8_4_ = fVar118 * auVar10._8_4_;
            auVar114._12_4_ = fVar118 * auVar10._12_4_;
            auVar265._0_4_ = fVar118 * auVar248._0_4_;
            auVar265._4_4_ = fVar118 * auVar248._4_4_;
            auVar265._8_4_ = fVar118 * auVar248._8_4_;
            auVar265._12_4_ = fVar118 * auVar248._12_4_;
            auVar248 = vminps_avx(auVar114,auVar265);
            auVar10 = vmaxps_avx(auVar265,auVar114);
            auVar152._0_4_ = fVar85 * auVar240._0_4_;
            auVar152._4_4_ = fVar85 * auVar240._4_4_;
            auVar152._8_4_ = fVar85 * auVar240._8_4_;
            auVar152._12_4_ = fVar85 * auVar240._12_4_;
            auVar219._0_4_ = fVar85 * auVar89._0_4_;
            auVar219._4_4_ = fVar85 * auVar89._4_4_;
            auVar219._8_4_ = fVar85 * auVar89._8_4_;
            auVar219._12_4_ = fVar85 * auVar89._12_4_;
            auVar240 = vminps_avx(auVar152,auVar219);
            auVar266._0_4_ = auVar248._0_4_ + auVar240._0_4_;
            auVar266._4_4_ = auVar248._4_4_ + auVar240._4_4_;
            auVar266._8_4_ = auVar248._8_4_ + auVar240._8_4_;
            auVar266._12_4_ = auVar248._12_4_ + auVar240._12_4_;
            fVar258 = auVar144._0_4_;
            auVar274._0_4_ = fVar258 * auVar134._0_4_;
            fVar259 = auVar144._4_4_;
            auVar274._4_4_ = fVar259 * auVar134._4_4_;
            fVar191 = auVar144._8_4_;
            auVar274._8_4_ = fVar191 * auVar134._8_4_;
            fVar192 = auVar144._12_4_;
            auVar274._12_4_ = fVar192 * auVar134._12_4_;
            auVar248 = vmaxps_avx(auVar219,auVar152);
            auVar220._0_4_ = fVar258 * auVar123._0_4_;
            auVar220._4_4_ = fVar259 * auVar123._4_4_;
            auVar220._8_4_ = fVar191 * auVar123._8_4_;
            auVar220._12_4_ = fVar192 * auVar123._12_4_;
            fVar60 = auVar145._0_4_;
            auVar100._0_4_ = fVar60 * auVar134._0_4_;
            fVar159 = auVar145._4_4_;
            auVar100._4_4_ = fVar159 * auVar134._4_4_;
            fVar59 = auVar145._8_4_;
            auVar100._8_4_ = fVar59 * auVar134._8_4_;
            fVar226 = auVar145._12_4_;
            auVar100._12_4_ = fVar226 * auVar134._12_4_;
            auVar235._0_4_ = fVar60 * auVar123._0_4_;
            auVar235._4_4_ = fVar159 * auVar123._4_4_;
            auVar235._8_4_ = fVar59 * auVar123._8_4_;
            auVar235._12_4_ = fVar226 * auVar123._12_4_;
            auVar115._0_4_ = auVar10._0_4_ + auVar248._0_4_;
            auVar115._4_4_ = auVar10._4_4_ + auVar248._4_4_;
            auVar115._8_4_ = auVar10._8_4_ + auVar248._8_4_;
            auVar115._12_4_ = auVar10._12_4_ + auVar248._12_4_;
            auVar153._8_8_ = 0x3f800000;
            auVar153._0_8_ = 0x3f800000;
            auVar10 = vsubps_avx(auVar153,auVar115);
            auVar248 = vsubps_avx(auVar153,auVar266);
            auVar267._0_4_ = fVar258 * auVar10._0_4_;
            auVar267._4_4_ = fVar259 * auVar10._4_4_;
            auVar267._8_4_ = fVar191 * auVar10._8_4_;
            auVar267._12_4_ = fVar192 * auVar10._12_4_;
            auVar251._0_4_ = fVar258 * auVar248._0_4_;
            auVar251._4_4_ = fVar259 * auVar248._4_4_;
            auVar251._8_4_ = fVar191 * auVar248._8_4_;
            auVar251._12_4_ = fVar192 * auVar248._12_4_;
            auVar116._0_4_ = fVar60 * auVar10._0_4_;
            auVar116._4_4_ = fVar159 * auVar10._4_4_;
            auVar116._8_4_ = fVar59 * auVar10._8_4_;
            auVar116._12_4_ = fVar226 * auVar10._12_4_;
            auVar154._0_4_ = fVar60 * auVar248._0_4_;
            auVar154._4_4_ = fVar159 * auVar248._4_4_;
            auVar154._8_4_ = fVar59 * auVar248._8_4_;
            auVar154._12_4_ = fVar226 * auVar248._12_4_;
            auVar10 = vminps_avx(auVar267,auVar251);
            auVar248 = vminps_avx(auVar116,auVar154);
            auVar10 = vminps_avx(auVar10,auVar248);
            auVar248 = vmaxps_avx(auVar251,auVar267);
            auVar240 = vmaxps_avx(auVar154,auVar116);
            auVar89 = vminps_avx(auVar274,auVar220);
            auVar134 = vminps_avx(auVar100,auVar235);
            auVar89 = vminps_avx(auVar89,auVar134);
            auVar10 = vhaddps_avx(auVar10,auVar89);
            auVar248 = vmaxps_avx(auVar240,auVar248);
            auVar240 = vmaxps_avx(auVar220,auVar274);
            auVar89 = vmaxps_avx(auVar235,auVar100);
            auVar240 = vmaxps_avx(auVar89,auVar240);
            auVar248 = vhaddps_avx(auVar248,auVar240);
            auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
            auVar248 = vshufps_avx(auVar248,auVar248,0xe8);
            auVar236._0_4_ = auVar180._0_4_ + auVar10._0_4_;
            auVar236._4_4_ = auVar180._4_4_ + auVar10._4_4_;
            auVar236._8_4_ = auVar180._8_4_ + auVar10._8_4_;
            auVar236._12_4_ = auVar180._12_4_ + auVar10._12_4_;
            auVar221._0_4_ = auVar180._0_4_ + auVar248._0_4_;
            auVar221._4_4_ = auVar180._4_4_ + auVar248._4_4_;
            auVar221._8_4_ = auVar180._8_4_ + auVar248._8_4_;
            auVar221._12_4_ = auVar180._12_4_ + auVar248._12_4_;
            auVar224 = ZEXT1664(auVar221);
            auVar10 = vmaxps_avx(auVar61,auVar236);
            auVar248 = vminps_avx(auVar221,auVar90);
            auVar10 = vcmpps_avx(auVar248,auVar10,1);
            auVar10 = vshufps_avx(auVar10,auVar10,0x50);
            if ((auVar10 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar10[0xf]) {
              bVar51 = 0;
              if ((fVar87 < auVar236._0_4_) && (bVar51 = 0, auVar221._0_4_ < auVar90._0_4_)) {
                auVar248 = vmovshdup_avx(auVar236);
                auVar10 = vcmpps_avx(auVar221,auVar90,1);
                bVar51 = auVar10[4] & auVar197._0_4_ < auVar248._0_4_;
              }
              if (((3 < uVar56 || fVar84 < 0.001) | bVar51) != 1) goto LAB_0162ad27;
              lVar50 = 200;
              do {
                fVar60 = auVar180._0_4_;
                fVar87 = 1.0 - fVar60;
                fVar84 = fVar87 * fVar87 * fVar87;
                fVar86 = fVar60 * 3.0 * fVar87 * fVar87;
                fVar87 = fVar87 * fVar60 * fVar60 * 3.0;
                auVar140._4_4_ = fVar84;
                auVar140._0_4_ = fVar84;
                auVar140._8_4_ = fVar84;
                auVar140._12_4_ = fVar84;
                auVar117._4_4_ = fVar86;
                auVar117._0_4_ = fVar86;
                auVar117._8_4_ = fVar86;
                auVar117._12_4_ = fVar86;
                auVar101._4_4_ = fVar87;
                auVar101._0_4_ = fVar87;
                auVar101._8_4_ = fVar87;
                auVar101._12_4_ = fVar87;
                fVar60 = fVar60 * fVar60 * fVar60;
                local_6f0 = auVar14._0_4_;
                fStack_6ec = auVar14._4_4_;
                fStack_6e8 = auVar14._8_4_;
                fStack_6e4 = auVar14._12_4_;
                auVar155._0_4_ = fVar60 * local_6f0;
                auVar155._4_4_ = fVar60 * fStack_6ec;
                auVar155._8_4_ = fVar60 * fStack_6e8;
                auVar155._12_4_ = fVar60 * fStack_6e4;
                auVar9 = vfmadd231ps_fma(auVar155,auVar101,auVar13);
                auVar9 = vfmadd231ps_fma(auVar9,auVar117,auVar12);
                auVar9 = vfmadd231ps_fma(auVar9,local_4e0,auVar140);
                auVar102._8_8_ = auVar9._0_8_;
                auVar102._0_8_ = auVar9._0_8_;
                auVar9 = vshufpd_avx(auVar9,auVar9,3);
                auVar10 = vshufps_avx(auVar180,auVar180,0x55);
                auVar9 = vsubps_avx(auVar9,auVar102);
                auVar10 = vfmadd213ps_fma(auVar9,auVar10,auVar102);
                fVar84 = auVar10._0_4_;
                auVar9 = vshufps_avx(auVar10,auVar10,0x55);
                auVar103._0_4_ = fVar118 * fVar84 + fVar85 * auVar9._0_4_;
                auVar103._4_4_ = auVar126._4_4_ * fVar84 + auVar63._4_4_ * auVar9._4_4_;
                auVar103._8_4_ = auVar126._8_4_ * fVar84 + auVar63._8_4_ * auVar9._8_4_;
                auVar103._12_4_ = auVar126._12_4_ * fVar84 + auVar63._12_4_ * auVar9._12_4_;
                auVar180 = vsubps_avx(auVar180,auVar103);
                auVar9 = vandps_avx(local_4f0,auVar10);
                auVar10 = vshufps_avx(auVar9,auVar9,0xf5);
                auVar9 = vmaxss_avx(auVar10,auVar9);
                if (auVar9._0_4_ < (float)local_390._0_4_) {
                  local_120 = auVar180._0_4_;
                  if ((local_120 < 0.0) || (1.0 < local_120)) break;
                  auVar9 = vmovshdup_avx(auVar180);
                  fVar84 = auVar9._0_4_;
                  if ((fVar84 < 0.0) || (1.0 < fVar84)) break;
                  auVar10 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar89 = vinsertps_avx(auVar10,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar10 = vdpps_avx(auVar89,local_500,0x7f);
                  auVar126 = vdpps_avx(auVar89,local_510,0x7f);
                  auVar63 = vdpps_avx(auVar89,local_3d0,0x7f);
                  auVar248 = vdpps_avx(auVar89,local_3e0,0x7f);
                  auVar61 = vdpps_avx(auVar89,local_3f0,0x7f);
                  auVar90 = vdpps_avx(auVar89,local_400,0x7f);
                  auVar240 = vdpps_avx(auVar89,local_410,0x7f);
                  auVar89 = vdpps_avx(auVar89,local_420,0x7f);
                  fVar86 = 1.0 - fVar84;
                  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar61._0_4_)),
                                            ZEXT416((uint)fVar86),auVar10);
                  auVar126 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ * fVar84)),
                                             ZEXT416((uint)fVar86),auVar126);
                  auVar224 = ZEXT1664(auVar126);
                  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar240._0_4_ * fVar84)),
                                            ZEXT416((uint)fVar86),auVar63);
                  auVar248 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar89._0_4_)),
                                             ZEXT416((uint)fVar86),auVar248);
                  fVar85 = 1.0 - local_120;
                  fVar86 = fVar85 * local_120 * local_120 * 3.0;
                  fVar159 = local_120 * local_120 * local_120;
                  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * auVar248._0_4_)),
                                            ZEXT416((uint)fVar86),auVar63);
                  fVar87 = local_120 * 3.0 * fVar85 * fVar85;
                  auVar126 = vfmadd231ss_fma(auVar63,ZEXT416((uint)fVar87),auVar126);
                  fVar118 = fVar85 * fVar85 * fVar85;
                  auVar10 = vfmadd231ss_fma(auVar126,ZEXT416((uint)fVar118),auVar10);
                  fVar60 = auVar10._0_4_;
                  if (((fVar60 < fVar57) ||
                      (fVar59 = *(float *)(ray + k * 4 + 0x100), fVar59 < fVar60)) ||
                     (pGVar5 = (context->scene->geometries).items[uVar47].ptr,
                     (pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                  auVar10 = vshufps_avx(auVar180,auVar180,0x55);
                  auVar222._8_4_ = 0x3f800000;
                  auVar222._0_8_ = 0x3f8000003f800000;
                  auVar222._12_4_ = 0x3f800000;
                  auVar126 = vsubps_avx(auVar222,auVar10);
                  fVar226 = auVar10._0_4_;
                  auVar237._0_4_ = fVar226 * (float)local_530._0_4_;
                  fVar258 = auVar10._4_4_;
                  auVar237._4_4_ = fVar258 * (float)local_530._4_4_;
                  fVar259 = auVar10._8_4_;
                  auVar237._8_4_ = fVar259 * fStack_528;
                  fVar191 = auVar10._12_4_;
                  auVar237._12_4_ = fVar191 * fStack_524;
                  auVar243._0_4_ = fVar226 * (float)local_570._0_4_;
                  auVar243._4_4_ = fVar258 * (float)local_570._4_4_;
                  auVar243._8_4_ = fVar259 * fStack_568;
                  auVar243._12_4_ = fVar191 * fStack_564;
                  auVar252._0_4_ = fVar226 * (float)local_580._0_4_;
                  auVar252._4_4_ = fVar258 * (float)local_580._4_4_;
                  auVar252._8_4_ = fVar259 * fStack_578;
                  auVar252._12_4_ = fVar191 * fStack_574;
                  auVar204._0_4_ = fVar226 * fVar158;
                  auVar204._4_4_ = fVar258 * fVar177;
                  auVar204._8_4_ = fVar259 * fVar178;
                  auVar204._12_4_ = fVar191 * fVar179;
                  auVar10 = vfmadd231ps_fma(auVar237,auVar126,local_520);
                  auVar63 = vfmadd231ps_fma(auVar243,auVar126,local_550);
                  auVar248 = vfmadd231ps_fma(auVar252,auVar126,local_560);
                  auVar61 = vfmadd231ps_fma(auVar204,auVar126,local_540);
                  auVar126 = vsubps_avx(auVar63,auVar10);
                  auVar224 = ZEXT1664(auVar126);
                  auVar10 = vsubps_avx(auVar248,auVar63);
                  auVar63 = vsubps_avx(auVar61,auVar248);
                  auVar253._0_4_ = local_120 * auVar10._0_4_;
                  auVar253._4_4_ = local_120 * auVar10._4_4_;
                  auVar253._8_4_ = local_120 * auVar10._8_4_;
                  auVar253._12_4_ = local_120 * auVar10._12_4_;
                  auVar187._4_4_ = fVar85;
                  auVar187._0_4_ = fVar85;
                  auVar187._8_4_ = fVar85;
                  auVar187._12_4_ = fVar85;
                  auVar248 = vfmadd231ps_fma(auVar253,auVar187,auVar126);
                  auVar205._0_4_ = local_120 * auVar63._0_4_;
                  auVar205._4_4_ = local_120 * auVar63._4_4_;
                  auVar205._8_4_ = local_120 * auVar63._8_4_;
                  auVar205._12_4_ = local_120 * auVar63._12_4_;
                  auVar10 = vfmadd231ps_fma(auVar205,auVar187,auVar10);
                  auVar206._0_4_ = local_120 * auVar10._0_4_;
                  auVar206._4_4_ = local_120 * auVar10._4_4_;
                  auVar206._8_4_ = local_120 * auVar10._8_4_;
                  auVar206._12_4_ = local_120 * auVar10._12_4_;
                  auVar63 = vfmadd231ps_fma(auVar206,auVar187,auVar248);
                  auVar174._0_4_ = fVar159 * (float)local_470._0_4_;
                  auVar174._4_4_ = fVar159 * (float)local_470._4_4_;
                  auVar174._8_4_ = fVar159 * fStack_468;
                  auVar174._12_4_ = fVar159 * fStack_464;
                  auVar129._4_4_ = fVar86;
                  auVar129._0_4_ = fVar86;
                  auVar129._8_4_ = fVar86;
                  auVar129._12_4_ = fVar86;
                  auVar10 = vfmadd132ps_fma(auVar129,auVar174,local_460);
                  auVar156._4_4_ = fVar87;
                  auVar156._0_4_ = fVar87;
                  auVar156._8_4_ = fVar87;
                  auVar156._12_4_ = fVar87;
                  auVar10 = vfmadd132ps_fma(auVar156,auVar10,local_450);
                  auVar175._0_4_ = auVar63._0_4_ * 3.0;
                  auVar175._4_4_ = auVar63._4_4_ * 3.0;
                  auVar175._8_4_ = auVar63._8_4_ * 3.0;
                  auVar175._12_4_ = auVar63._12_4_ * 3.0;
                  auVar141._4_4_ = fVar118;
                  auVar141._0_4_ = fVar118;
                  auVar141._8_4_ = fVar118;
                  auVar141._12_4_ = fVar118;
                  auVar63 = vfmadd132ps_fma(auVar141,auVar10,local_440);
                  auVar10 = vshufps_avx(auVar175,auVar175,0xc9);
                  auVar130._0_4_ = auVar63._0_4_ * auVar10._0_4_;
                  auVar130._4_4_ = auVar63._4_4_ * auVar10._4_4_;
                  auVar130._8_4_ = auVar63._8_4_ * auVar10._8_4_;
                  auVar130._12_4_ = auVar63._12_4_ * auVar10._12_4_;
                  auVar10 = vshufps_avx(auVar63,auVar63,0xc9);
                  auVar10 = vfmsub231ps_fma(auVar130,auVar175,auVar10);
                  local_140 = auVar10._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar60;
                    uVar58 = vextractps_avx(auVar10,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar58;
                    uVar58 = vextractps_avx(auVar10,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar58;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar84;
                    *(uint *)(ray + k * 4 + 0x220) = uVar4;
                    *(uint *)(ray + k * 4 + 0x240) = uVar47;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_100 = auVar9._0_8_;
                  auVar9 = vmovshdup_avx(auVar10);
                  local_180 = auVar9._0_8_;
                  auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
                  local_160 = auVar9._0_8_;
                  uStack_178 = local_180;
                  uStack_170 = local_180;
                  uStack_168 = local_180;
                  uStack_158 = local_160;
                  uStack_150 = local_160;
                  uStack_148 = local_160;
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  uStack_f8 = local_100;
                  uStack_f0 = local_100;
                  uStack_e8 = local_100;
                  local_e0 = CONCAT44(uStack_33c,local_340);
                  uStack_d8 = CONCAT44(uStack_334,uStack_338);
                  uStack_d0 = CONCAT44(uStack_32c,uStack_330);
                  uStack_c8 = CONCAT44(uStack_324,uStack_328);
                  local_c0._4_4_ = uStack_31c;
                  local_c0._0_4_ = local_320;
                  local_c0._8_4_ = uStack_318;
                  local_c0._12_4_ = uStack_314;
                  local_c0._16_4_ = uStack_310;
                  local_c0._20_4_ = uStack_30c;
                  local_c0._24_4_ = uStack_308;
                  local_c0._28_4_ = uStack_304;
                  vpcmpeqd_avx2(local_c0,local_c0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar60;
                  local_4a0 = local_360;
                  local_5d0.valid = (int *)local_4a0;
                  local_5d0.geometryUserPtr = pGVar5->userPtr;
                  local_5d0.context = context->user;
                  local_5d0.hit = (RTCHitN *)&local_180;
                  local_5d0.N = 8;
                  local_5d0.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar224 = ZEXT1664(auVar126);
                    (*pGVar5->intersectionFilterN)(&local_5d0);
                  }
                  auVar79 = vpcmpeqd_avx2(local_4a0,_DAT_01faff00);
                  auVar79 = _DAT_01fe9960 & ~auVar79;
                  if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar79 >> 0x7f,0) != '\0') ||
                        (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar79 >> 0xbf,0) != '\0') ||
                      (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar79[0x1f] < '\0') {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar224 = ZEXT1664(auVar224._0_16_);
                      (*p_Var6)(&local_5d0);
                    }
                    auVar16 = vpcmpeqd_avx2(local_4a0,_DAT_01faff00);
                    auVar79 = _DAT_01fe9960 & ~auVar16;
                    if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar79 >> 0x7f,0) != '\0') ||
                          (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar79 >> 0xbf,0) != '\0') ||
                        (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar79[0x1f] < '\0') {
                      auVar83._0_8_ = auVar16._0_8_ ^ 0xffffffffffffffff;
                      auVar83._8_4_ = auVar16._8_4_ ^ 0xffffffff;
                      auVar83._12_4_ = auVar16._12_4_ ^ 0xffffffff;
                      auVar83._16_4_ = auVar16._16_4_ ^ 0xffffffff;
                      auVar83._20_4_ = auVar16._20_4_ ^ 0xffffffff;
                      auVar83._24_4_ = auVar16._24_4_ ^ 0xffffffff;
                      auVar83._28_4_ = auVar16._28_4_ ^ 0xffffffff;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])local_5d0.hit);
                      *(undefined1 (*) [32])(local_5d0.ray + 0x180) = auVar79;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0x20))
                      ;
                      *(undefined1 (*) [32])(local_5d0.ray + 0x1a0) = auVar79;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0x40))
                      ;
                      *(undefined1 (*) [32])(local_5d0.ray + 0x1c0) = auVar79;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0x60))
                      ;
                      *(undefined1 (*) [32])(local_5d0.ray + 0x1e0) = auVar79;
                      auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0x80))
                      ;
                      *(undefined1 (*) [32])(local_5d0.ray + 0x200) = auVar79;
                      auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0xa0)
                                               );
                      *(undefined1 (*) [32])(local_5d0.ray + 0x220) = auVar79;
                      auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0xc0)
                                               );
                      *(undefined1 (*) [32])(local_5d0.ray + 0x240) = auVar79;
                      auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5d0.hit + 0xe0)
                                               );
                      *(undefined1 (*) [32])(local_5d0.ray + 0x260) = auVar79;
                      auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])
                                                         (local_5d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_5d0.ray + 0x280) = auVar79;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar59;
                  break;
                }
                lVar50 = lVar50 + -1;
              } while (lVar50 != 0);
            }
          }
        }
        else {
          auVar248 = vcmpps_avx(auVar248,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar90 = vcmpps_avx(auVar61,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar248 = vandps_avx(auVar90,auVar248);
          if (-0.0001 < fVar85 && (auVar248 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_0162a0ab;
        }
        if (uVar56 == 0) break;
      } while( true );
    }
    uVar58 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar78._4_4_ = uVar58;
    auVar78._0_4_ = uVar58;
    auVar78._8_4_ = uVar58;
    auVar78._12_4_ = uVar58;
    auVar9 = vcmpps_avx(local_480,auVar78,2);
    uVar47 = vmovmskps_avx(auVar9);
    uVar47 = (uint)uVar55 & uVar47;
    if (uVar47 == 0) {
      return;
    }
  } while( true );
LAB_0162ad27:
  local_430 = vinsertps_avx(auVar9,ZEXT416((uint)fVar86),0x10);
  auVar66 = vinsertps_avx(auVar197,ZEXT416((uint)auVar198._0_4_),0x10);
  goto LAB_016297f9;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }